

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.c
# Opt level: O0

void av1_convolve_y_sr_avx2
               (uint8_t *src,int32_t src_stride,uint8_t *dst,int32_t dst_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_y,int32_t subpel_y_qn)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i res_11;
  __m128i res_12;
  __m128i res_13;
  __m256i s0;
  __m256i s0_00;
  __m256i s0_01;
  __m256i s0_02;
  __m256i s0_03;
  __m256i s0_04;
  __m256i s0_05;
  __m256i s0_06;
  __m256i s0_07;
  __m256i s0_08;
  __m256i s0_09;
  __m256i s0_10;
  __m256i s0_11;
  __m256i s0_12;
  __m256i res_14;
  __m256i res_15;
  __m256i res_16;
  __m256i s0_13;
  __m256i s0_14;
  __m256i s0_15;
  __m256i s0_16;
  __m256i s0_17;
  __m256i s0_18;
  __m256i s0_19;
  __m256i s0_20;
  __m256i s0_21;
  __m256i s0_22;
  __m256i s0_23;
  __m256i s0_24;
  __m256i s0_25;
  __m256i s0_26;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  undefined8 uVar105;
  int16_t iVar106;
  int iVar107;
  undefined8 *puVar108;
  int in_ECX;
  ulong *puVar109;
  __m256i *in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  int in_ESI;
  ulong uVar110;
  long lVar111;
  __m128i *palVar112;
  __m128i *in_RDI;
  __m128i *ss;
  undefined1 (*pauVar113) [32];
  undefined1 (*pauVar114) [16];
  int in_R8D;
  int in_R9D;
  longlong lVar115;
  longlong lVar116;
  undefined8 uVar119;
  longlong lVar120;
  longlong lVar121;
  undefined1 auVar117 [16];
  undefined8 uVar122;
  undefined1 auVar118 [32];
  __m128i alVar123;
  __m128i src_00;
  __m128i res_17;
  __m128i src_01;
  __m128i src_02;
  __m128i src_03;
  __m128i src_04;
  __m128i res_18;
  __m128i src_05;
  __m128i src_06;
  __m128i res_19;
  __m128i src_07;
  __m128i src_08;
  __m128i res_20;
  __m128i src_09;
  __m128i s_65;
  __m128i v;
  __m128i v_00;
  undefined8 in_stack_00000008;
  int vert_tap;
  uint8_t *d_3;
  uint8_t *s_2;
  __m256i r_15 [4];
  __m256i tt_256_3 [8];
  __m256i ss_256_9 [8];
  __m256i s_256_9 [8];
  __m256i src56_3;
  __m256i src45_3;
  __m256i src34_7;
  __m256i src23_7;
  __m256i src12_11;
  __m256i src01_11;
  __m256i r_14 [2];
  __m256i ss_256_8 [8];
  __m128i s_128_5 [8];
  __m256i res_10;
  __m256i src56_2;
  __m256i src45_2;
  __m256i src34_6;
  __m256i src23_6;
  __m256i src12_10;
  __m256i src01_10;
  __m256i ss_256_7 [4];
  __m128i s_64_4 [8];
  __m128i r_13;
  __m128i res_9;
  __m128i src56_1;
  __m128i src45_1;
  __m128i src34_5;
  __m128i src23_5;
  __m128i src12_9;
  __m128i src01_9;
  __m128i ss_128_5 [4];
  __m128i s_32_4 [8];
  __m128i r_12;
  __m128i res_8;
  __m128i src56;
  __m128i src45;
  __m128i src34_4;
  __m128i src23_4;
  __m128i src12_8;
  __m128i src01_8;
  __m128i ss_128_4 [4];
  __m128i s_16_4 [8];
  uint8_t *src_ptr_3;
  uint8_t *d_2;
  uint8_t *s_1;
  __m256i r_11 [4];
  __m256i tt_256_2 [6];
  __m256i ss_256_6 [6];
  __m256i s_256_8 [6];
  __m256i src34_3;
  __m256i src23_3;
  __m256i src12_7;
  __m256i src01_7;
  __m256i r_10 [2];
  __m256i ss_256_5 [6];
  __m128i s_128_4 [6];
  __m256i res_7;
  __m256i src34_2;
  __m256i src23_2;
  __m256i src12_6;
  __m256i src01_6;
  __m256i ss_256_4 [3];
  __m128i s_64_3 [6];
  __m128i r_9;
  __m128i res_6;
  __m128i src34_1;
  __m128i src23_1;
  __m128i src12_5;
  __m128i src01_5;
  __m128i ss_128_3 [3];
  __m128i s_32_3 [6];
  __m128i r_8;
  __m128i res_5;
  __m128i src34;
  __m128i src23;
  __m128i src12_4;
  __m128i src01_4;
  __m128i ss_128_2 [3];
  __m128i s_16_3 [6];
  uint8_t *src_ptr_2;
  uint8_t *d_1;
  uint8_t *s;
  __m256i r_7 [4];
  __m256i tt_256_1 [4];
  __m256i ss_256_3 [4];
  __m256i s_256_7 [4];
  __m256i r_6 [4];
  __m256i tt_256 [4];
  __m256i ss_256_2 [4];
  __m256i s_256_6 [4];
  __m256i src12_3;
  __m256i src01_3;
  __m256i r_5 [2];
  __m256i ss_256_1 [4];
  __m128i s_128_3 [4];
  __m256i res_4;
  __m256i src12_2;
  __m256i src01_2;
  __m256i ss_256 [2];
  __m128i s_64_2 [4];
  __m128i r_4;
  __m128i res_3;
  __m128i src12_1;
  __m128i src01_1;
  __m128i ss_128_1 [2];
  __m128i s_32_2 [4];
  __m128i r_3;
  __m128i res_2;
  __m128i src12;
  __m128i src01;
  __m128i ss_128 [2];
  __m128i s_16_2 [4];
  uint8_t *src_ptr_1;
  __m256i s_256_5 [2] [4];
  __m256i s_256_4 [2] [2];
  __m256i s_256_3 [2];
  __m128i d1_3;
  __m128i d0_3;
  __m128i s_128_2 [2];
  __m128i d1_2;
  __m128i d0_2;
  __m128i s_64_1 [2];
  __m128i d1_1;
  __m128i d0_1;
  __m128i s_32_1 [2];
  __m128i d1;
  __m128i d0;
  __m128i s_16_1 [2];
  __m256i s_256_2 [2] [4];
  __m256i s_256_1 [2] [2];
  __m256i s_256 [2];
  __m256i r_2 [2];
  __m128i s_128_1 [2];
  __m128i d;
  __m128i r1;
  __m128i r0;
  __m128i res1;
  __m128i res0;
  __m128i ss1;
  __m128i ss0;
  __m128i s_128 [2];
  __m128i s_64 [2];
  __m128i r_1;
  __m128i res_1;
  __m128i s_32 [2];
  __m128i r;
  __m128i res;
  __m128i s_16 [2];
  uint8_t *src_ptr;
  int vert_tap_1;
  __m256i coeffs_256 [4];
  __m128i coeffs_128 [4];
  int32_t y;
  int32_t x;
  uint8_t *puVar124;
  undefined4 in_stack_ffffffffffffc148;
  int in_stack_ffffffffffffc14c;
  int in_stack_ffffffffffffc150;
  undefined4 in_stack_ffffffffffffc154;
  longlong in_stack_ffffffffffffc158;
  __m256i *in_stack_ffffffffffffc160;
  undefined4 in_stack_ffffffffffffc180;
  __m256i *in_stack_ffffffffffffc190;
  __m128i *in_stack_ffffffffffffc198;
  __m256i *in_stack_ffffffffffffc1a0;
  undefined4 in_stack_ffffffffffffc1a8;
  int32_t in_stack_ffffffffffffc1ac;
  InterpFilterParams *in_stack_ffffffffffffc1b0;
  __m256i *in_stack_ffffffffffffc1b8;
  __m256i *in_stack_ffffffffffffc1c0;
  __m128i *in_stack_ffffffffffffc1c8;
  __m256i *in_stack_ffffffffffffc1d0;
  ptrdiff_t in_stack_ffffffffffffc1d8;
  uint8_t *in_stack_ffffffffffffc1e0;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 local_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 local_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 local_3610;
  undefined8 uStack_3608;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 local_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 local_34f0;
  undefined8 uStack_34e8;
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 local_34d0;
  undefined8 uStack_34c8;
  ulong local_3480;
  undefined8 uStack_3478;
  ulong local_3470;
  undefined8 uStack_3468;
  ulong local_3460;
  undefined8 uStack_3458;
  ulong local_3450;
  undefined8 uStack_3448;
  ulong local_3440;
  undefined8 uStack_3438;
  ulong local_3430;
  undefined8 uStack_3428;
  ulong local_3420;
  undefined8 uStack_3418;
  undefined1 (*local_33f8) [16];
  long local_33f0;
  undefined1 (*local_33e8) [32];
  uint8_t local_33e0 [128];
  undefined1 local_3360 [32];
  undefined1 local_3340 [32];
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined1 local_3300 [32];
  undefined1 local_32e0 [32];
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined1 local_32a0 [32];
  undefined1 local_3280 [32];
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined1 local_3240 [32];
  undefined1 local_3220 [32];
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined1 local_3060 [32];
  undefined1 local_3040 [32];
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined1 local_3000 [32];
  undefined1 in_stack_ffffffffffffd020 [32];
  undefined1 auVar126 [28];
  undefined1 auVar125 [32];
  uint8_t *in_stack_ffffffffffffd040;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 local_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 local_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 local_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  ulong local_2c60;
  undefined8 uStack_2c58;
  ulong local_2c50;
  undefined8 uStack_2c48;
  ulong local_2c40;
  undefined8 uStack_2c38;
  ulong local_2c30;
  undefined8 uStack_2c28;
  ulong local_2c20;
  undefined8 uStack_2c18;
  undefined1 (*local_2bf8) [16];
  long local_2bf0;
  undefined1 (*local_2be8) [32];
  uint8_t local_2be0 [128];
  undefined1 local_2b60 [32];
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined1 local_2b20 [32];
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined1 local_2ae0 [32];
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined1 local_2aa0 [32];
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  uint8_t local_29e0 [128];
  undefined1 local_2960 [32];
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined1 local_2920 [32];
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined1 local_28e0 [32];
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined1 local_28a0 [32];
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined1 local_2760 [32];
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined1 local_2720 [32];
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 local_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined1 local_26a0 [32];
  ulong local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  ulong local_2660;
  undefined8 uStack_2658;
  ulong uStack_2650;
  undefined8 uStack_2648;
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  ulong local_25f0;
  undefined8 uStack_25e8;
  ulong local_25e0;
  undefined8 uStack_25d8;
  undefined8 local_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25b0;
  undefined8 uStack_25a8;
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  ulong local_2550;
  undefined8 uStack_2548;
  ulong local_2540;
  undefined8 uStack_2538;
  ulong local_2530;
  undefined8 uStack_2528;
  undefined8 local_2510;
  undefined8 uStack_2508;
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [16];
  ulong local_24b0;
  undefined8 uStack_24a8;
  ulong local_24a0;
  undefined8 uStack_2498;
  ulong local_2490;
  undefined8 uStack_2488;
  undefined1 (*local_2468) [32];
  longlong local_2460;
  longlong lStack_2458;
  longlong lStack_2450;
  longlong lStack_2448;
  longlong local_2440;
  longlong lStack_2438;
  longlong lStack_2430;
  longlong lStack_2428;
  longlong local_2420;
  longlong lStack_2418;
  longlong lStack_2410;
  longlong lStack_2408;
  longlong local_2400;
  longlong lStack_23f8;
  longlong lStack_23f0;
  longlong lStack_23e8;
  longlong local_2360;
  longlong lStack_2358;
  longlong lStack_2350;
  longlong lStack_2348;
  longlong local_2340;
  longlong lStack_2338;
  longlong lStack_2330;
  longlong lStack_2328;
  longlong local_22e0;
  longlong lStack_22d8;
  longlong lStack_22d0;
  longlong lStack_22c8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  longlong local_2290;
  longlong lStack_2288;
  longlong local_2280;
  longlong lStack_2278;
  undefined8 local_2260;
  longlong local_2250;
  ulong local_2240;
  undefined1 local_2220 [16];
  undefined1 local_2210 [16];
  ulong local_2200;
  undefined8 uStack_21f8;
  ulong local_21f0;
  undefined8 uStack_21e8;
  ulong local_21c0;
  longlong local_21a0;
  longlong lStack_2198;
  longlong lStack_2190;
  longlong lStack_2188;
  longlong local_2180;
  longlong lStack_2178;
  longlong lStack_2170;
  longlong lStack_2168;
  longlong local_2160;
  longlong lStack_2158;
  longlong lStack_2150;
  longlong lStack_2148;
  longlong local_2140;
  longlong lStack_2138;
  longlong lStack_2130;
  longlong lStack_2128;
  longlong local_20a0;
  longlong lStack_2098;
  longlong lStack_2090;
  longlong lStack_2088;
  longlong local_2080;
  longlong lStack_2078;
  longlong lStack_2070;
  longlong lStack_2068;
  longlong local_2020;
  longlong lStack_2018;
  longlong lStack_2010;
  longlong lStack_2008;
  longlong local_1fa0;
  longlong lStack_1f98;
  undefined1 local_1f80 [16];
  longlong local_1f70;
  longlong lStack_1f68;
  longlong local_1f60;
  longlong lStack_1f58;
  __m128i local_1f50;
  __m128i local_1f40;
  __m128i local_1f30;
  __m128i local_1f20;
  undefined1 local_1f10 [16];
  undefined1 local_1f00 [16];
  ulong local_1ef0;
  undefined8 uStack_1ee8;
  ulong local_1ee0;
  undefined8 uStack_1ed8;
  ulong local_1ed0;
  undefined8 uStack_1ec8;
  ulong local_1ec0;
  undefined8 uStack_1eb8;
  ulong local_1eb0;
  undefined8 uStack_1ea8;
  ulong local_1e90;
  undefined8 uStack_1e88;
  ulong local_1e80;
  undefined8 uStack_1e78;
  ulong local_1e70 [4];
  __m128i *local_1e50;
  int local_1e44;
  longlong local_1db0 [8];
  int local_1d6c;
  int local_1d68;
  int local_1d64;
  undefined8 local_1d60;
  int local_1d54;
  int local_1d50;
  int local_1d4c;
  __m256i *local_1d48;
  int local_1d3c;
  __m128i *local_1d38;
  undefined1 local_1d30 [16];
  uint local_1d14;
  undefined1 local_1d10 [16];
  uint local_1cf4;
  ulong local_1cf0;
  ulong local_1cd0;
  ulong local_1cb0;
  undefined1 local_1c90 [16];
  uint local_1c74;
  undefined1 local_1c70 [16];
  uint local_1c54;
  undefined1 local_1c50 [16];
  uint local_1c34;
  undefined1 local_1c30 [16];
  uint local_1c14;
  undefined1 local_1c10 [16];
  uint local_1bf4;
  undefined1 local_1bf0 [16];
  uint local_1bd4;
  undefined1 local_1bd0 [16];
  uint local_1bb4;
  undefined1 local_1bb0 [16];
  uint local_1b94;
  undefined1 local_1b90 [16];
  uint local_1b74;
  undefined1 local_1b70 [16];
  uint local_1b54;
  undefined1 local_1b50 [16];
  uint local_1b34;
  undefined1 local_1b30 [16];
  uint local_1b14;
  undefined1 local_1b10 [16];
  uint local_1af4;
  undefined1 local_1af0 [16];
  uint local_1ad4;
  undefined1 local_1ad0 [16];
  uint local_1ab4;
  undefined1 local_1ab0 [16];
  uint local_1a94;
  undefined1 local_1a90 [16];
  uint local_1a74;
  undefined1 local_1a70 [16];
  uint local_1a54;
  undefined1 local_1a50 [16];
  uint local_1a34;
  undefined1 local_1a30 [16];
  uint local_1a14;
  undefined1 local_1a10 [16];
  uint local_19f4;
  undefined1 local_19f0 [16];
  uint local_19d4;
  undefined1 local_19d0 [16];
  uint local_19b4;
  undefined1 local_19b0 [16];
  uint local_1994;
  undefined1 local_1990 [16];
  uint local_1974;
  undefined1 local_1970 [16];
  uint local_1954;
  undefined1 local_1950 [16];
  uint local_1934;
  undefined1 local_1930 [16];
  uint local_1914;
  undefined1 local_1910 [16];
  uint local_18f4;
  undefined1 local_18f0 [16];
  uint local_18d4;
  undefined1 local_18d0 [16];
  uint local_18b4;
  undefined1 local_18b0 [16];
  uint local_1894;
  undefined1 local_1890 [16];
  uint local_187c;
  __m128i *local_1878;
  undefined8 *local_1858;
  undefined1 (*local_1850) [16];
  undefined1 (*local_1848) [32];
  undefined8 *local_1840;
  undefined1 (*local_1838) [16];
  undefined1 (*local_1830) [16];
  undefined1 (*local_1828) [16];
  undefined1 (*local_1820) [16];
  undefined8 *local_1818;
  undefined1 (*local_1810) [16];
  undefined1 (*local_1808) [16];
  undefined1 (*local_1800) [16];
  undefined1 (*local_17f8) [16];
  undefined1 (*local_17f0) [16];
  undefined1 (*local_17e8) [16];
  ulong local_17e0;
  undefined8 uStack_17d8;
  ulong local_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 local_17b0;
  undefined8 uStack_17a8;
  ulong local_17a0;
  undefined8 uStack_1798;
  ulong local_1790;
  undefined8 uStack_1788;
  ulong local_1780;
  undefined8 uStack_1778;
  ulong local_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 local_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 local_1730;
  undefined8 uStack_1728;
  ulong local_1720;
  undefined8 uStack_1718;
  ulong local_1710;
  undefined8 uStack_1708;
  ulong local_1700;
  undefined8 uStack_16f8;
  ulong local_16f0;
  undefined8 uStack_16e8;
  ulong local_16e0;
  undefined8 uStack_16d8;
  ulong local_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 local_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 local_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 local_1670;
  undefined8 uStack_1668;
  ulong local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  ulong local_1640;
  undefined8 uStack_1638;
  ulong uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  ulong local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  ulong local_14c0;
  undefined8 uStack_14b8;
  ulong uStack_14b0;
  undefined8 uStack_14a8;
  ulong local_14a0;
  undefined8 uStack_1498;
  ulong uStack_1490;
  undefined8 uStack_1488;
  ulong local_1480;
  undefined8 uStack_1478;
  ulong uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  ulong local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  ulong local_12c0;
  undefined8 uStack_12b8;
  ulong uStack_12b0;
  undefined8 uStack_12a8;
  ulong local_12a0;
  undefined8 uStack_1298;
  ulong uStack_1290;
  undefined8 uStack_1288;
  ulong local_1280;
  undefined8 uStack_1278;
  ulong uStack_1270;
  undefined8 uStack_1268;
  ulong local_1260;
  undefined8 uStack_1258;
  ulong uStack_1250;
  undefined8 uStack_1248;
  ulong local_1240;
  undefined8 uStack_1238;
  ulong uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  longlong local_a90;
  undefined8 uStack_a88;
  __m256i *local_a78;
  ulong local_9f0;
  undefined8 uStack_9e8;
  ulong *local_9d8;
  ulong local_9d0;
  undefined8 uStack_9c8;
  ulong *local_9b8;
  ulong local_9b0;
  undefined8 uStack_9a8;
  __m128i *local_998;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 *local_918;
  ulong local_910;
  undefined8 uStack_908;
  ulong *local_8f8;
  ulong local_8f0;
  undefined8 uStack_8e8;
  undefined1 (*local_8d8) [32];
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 *local_8b8;
  ulong local_8b0;
  undefined8 uStack_8a8;
  ulong *local_898;
  ulong local_890;
  undefined8 uStack_888;
  ulong *local_878;
  ulong local_870;
  undefined8 uStack_868;
  ulong *local_858;
  ulong local_850;
  undefined8 uStack_848;
  undefined1 (*local_838) [16];
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 *local_818;
  ulong local_810;
  undefined8 uStack_808;
  ulong *local_7f8;
  ulong local_7f0;
  undefined8 uStack_7e8;
  ulong *local_7d8;
  ulong local_7d0;
  undefined8 uStack_7c8;
  ulong *local_7b8;
  ulong local_7b0;
  undefined8 uStack_7a8;
  ulong *local_798;
  ulong local_790;
  undefined8 uStack_788;
  ulong *local_778;
  ulong local_770;
  undefined8 uStack_768;
  undefined1 (*local_758) [16];
  ulong local_750;
  undefined8 uStack_748;
  ulong local_740;
  undefined8 uStack_738;
  ulong local_730;
  undefined8 uStack_728;
  ulong local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  longlong local_550;
  longlong lStack_548;
  longlong local_540;
  longlong lStack_538;
  __m128i *local_530;
  __m128i *local_528;
  __m128i *local_520;
  __m128i *local_518;
  __m128i *local_510;
  __m128i *local_508;
  __m128i *local_500;
  __m128i *local_4f8;
  __m128i *local_4f0;
  __m128i *local_4e8;
  __m128i *local_4e0;
  __m128i *local_4d8;
  __m128i *local_4d0;
  __m128i *local_4c8;
  undefined1 (*local_4c0) [32];
  undefined1 (*local_4b8) [32];
  undefined1 (*local_4b0) [32];
  undefined1 (*local_4a8) [32];
  undefined1 (*local_4a0) [32];
  undefined1 (*local_498) [32];
  undefined1 (*local_490) [32];
  undefined1 (*local_488) [32];
  undefined1 (*local_480) [32];
  undefined1 (*local_478) [32];
  undefined1 (*local_470) [32];
  undefined1 (*local_468) [32];
  undefined1 (*local_460) [32];
  undefined1 (*local_458) [32];
  undefined1 (*local_450) [32];
  undefined1 (*local_448) [32];
  undefined1 (*local_440) [32];
  undefined1 (*local_438) [32];
  ulong local_3f0;
  undefined8 uStack_3e8;
  ulong local_3e0;
  undefined8 uStack_3d8;
  ulong local_3d0;
  undefined8 uStack_3c8;
  ulong local_3c0;
  undefined8 uStack_3b8;
  ulong local_330;
  undefined8 uStack_328;
  ulong local_320;
  undefined8 uStack_318;
  ulong local_310;
  undefined8 uStack_308;
  ulong local_300;
  undefined8 uStack_2f8;
  ulong local_2f0;
  undefined8 uStack_2e8;
  ulong local_2e0;
  undefined8 uStack_2d8;
  ulong local_2d0;
  undefined8 uStack_2c8;
  ulong local_2c0;
  undefined8 uStack_2b8;
  ulong local_2b0;
  undefined8 uStack_2a8;
  ulong local_2a0;
  undefined8 uStack_298;
  ulong local_290;
  undefined8 uStack_288;
  ulong local_280;
  undefined8 uStack_278;
  ulong local_270;
  undefined8 uStack_268;
  ulong local_260;
  undefined8 uStack_258;
  ulong local_250;
  undefined8 uStack_248;
  ulong local_240;
  undefined8 uStack_238;
  ulong local_230;
  undefined8 uStack_228;
  ulong local_220;
  undefined8 uStack_218;
  ulong local_210;
  undefined8 uStack_208;
  ulong local_200;
  undefined8 uStack_1f8;
  ulong local_1f0;
  undefined8 uStack_1e8;
  ulong local_1e0;
  undefined8 uStack_1d8;
  ulong local_1d0;
  undefined8 uStack_1c8;
  ulong local_1c0;
  undefined8 uStack_1b8;
  ulong local_1b0;
  undefined8 uStack_1a8;
  ulong local_1a0;
  undefined8 uStack_198;
  ulong local_190;
  undefined8 uStack_188;
  ulong local_180;
  undefined8 uStack_178;
  ulong local_170;
  undefined8 uStack_168;
  ulong local_160;
  undefined8 uStack_158;
  ulong local_150;
  undefined8 uStack_148;
  ulong local_140;
  undefined8 uStack_138;
  ulong local_130;
  undefined8 uStack_128;
  ulong local_120;
  undefined8 uStack_118;
  ulong local_110;
  undefined8 uStack_108;
  ulong local_100;
  undefined8 uStack_f8;
  ulong local_f0;
  undefined8 uStack_e8;
  ulong local_e0;
  undefined8 uStack_d8;
  ulong local_d0;
  undefined8 uStack_c8;
  ulong local_c0;
  undefined8 uStack_b8;
  ulong local_b0;
  undefined8 uStack_a8;
  ulong local_a0;
  undefined8 uStack_98;
  ulong local_90;
  undefined8 uStack_88;
  ulong local_80;
  undefined8 uStack_78;
  ulong local_70;
  undefined8 uStack_68;
  ulong local_60;
  undefined8 uStack_58;
  ulong local_50;
  undefined8 uStack_48;
  ulong local_40;
  undefined8 uStack_38;
  
  auVar126 = in_stack_ffffffffffffd020._4_28_;
  iVar107 = get_filter_tap((InterpFilterParams *)
                           CONCAT44(in_stack_ffffffffffffc154,in_stack_ffffffffffffc150),
                           in_stack_ffffffffffffc14c);
  if (iVar107 == 0xc) {
    av1_convolve_y_sr_general_avx2
              (in_stack_ffffffffffffd040,auVar126._24_4_,auVar126._12_8_,auVar126._8_4_,
               auVar126._4_4_,auVar126._0_4_,
               (InterpFilterParams *)CONCAT44(in_stack_ffffffffffffc14c,(int)filter_params_y),
               in_stack_ffffffffffffc150);
  }
  else {
    local_1d60 = in_stack_00000008;
    local_1d64 = (int)filter_params_y;
    uVar110 = (ulong)filter_params_y & 0xffffffff;
    local_1d54 = in_R9D;
    local_1d50 = in_R8D;
    local_1d4c = in_ECX;
    local_1d48 = in_RDX;
    local_1d3c = in_ESI;
    local_1d38 = in_RDI;
    local_1e44 = get_filter_tap((InterpFilterParams *)
                                CONCAT44(in_stack_ffffffffffffc154,in_stack_ffffffffffffc150),
                                in_stack_ffffffffffffc14c);
    if (local_1e44 == 2) {
      local_1e50 = local_1d38;
      local_1d6c = local_1d54;
      if (local_1d64 == 8) {
        if (local_1d50 < 9) {
          if (local_1d50 == 2) {
            local_1cb0 = (ulong)(uint)(int)(short)(*local_1d38)[0];
            local_21c0 = local_1cb0;
            do {
              local_1cd0 = CONCAT44(0,(int)*(short *)((long)*local_1e50 + (long)local_1d3c));
              auVar50._8_8_ = 0;
              auVar50._0_8_ = local_21c0;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = local_1cd0;
              auVar117 = vpavgb_avx(auVar50,auVar49);
              *(short *)*local_1d48 = auVar117._0_2_;
              local_1cf0 = CONCAT44(0,(int)*(short *)((long)*local_1e50 + (long)(local_1d3c * 2)));
              local_21c0 = local_1cf0;
              auVar48._8_8_ = 0;
              auVar48._0_8_ = local_1cd0;
              auVar47._8_8_ = 0;
              auVar47._0_8_ = local_1cf0;
              auVar117 = vpavgb_avx(auVar48,auVar47);
              *(short *)((long)*local_1d48 + (long)local_1d4c) = auVar117._0_2_;
              local_1e50 = (__m128i *)((long)*local_1e50 + (long)(local_1d3c << 1));
              local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
              local_1d6c = local_1d6c + -2;
            } while (local_1d6c != 0);
          }
          else if (local_1d50 == 4) {
            local_1c34 = loadu_int32(local_1d38);
            local_1c50._4_4_ = 0;
            local_1c50._0_4_ = local_1c34;
            local_2200 = local_1c50._0_8_;
            uStack_21f8 = 0;
            local_1c50 = ZEXT416(local_1c34);
            do {
              local_1c54 = loadu_int32((uint8_t *)((long)*local_1e50 + (long)local_1d3c));
              local_1c70._4_4_ = 0;
              local_1c70._0_4_ = local_1c54;
              local_21f0 = local_1c70._0_8_;
              uStack_21e8 = 0;
              local_3c0 = local_2200;
              uStack_3b8 = uStack_21f8;
              local_3d0 = local_1c70._0_8_;
              uStack_3c8 = 0;
              auVar54._8_8_ = uStack_21f8;
              auVar54._0_8_ = local_2200;
              auVar53._8_8_ = 0;
              auVar53._0_8_ = local_1c70._0_8_;
              local_2210 = vpavgb_avx(auVar54,auVar53);
              v[1] = extraout_RDX;
              v[0] = uVar110;
              local_1c70 = ZEXT416(local_1c54);
              xx_storel_32(local_1d48,v);
              local_1c74 = loadu_int32((uint8_t *)((long)*local_1e50 + (long)(local_1d3c * 2)));
              local_1c90._4_4_ = 0;
              local_1c90._0_4_ = local_1c74;
              local_2200 = local_1c90._0_8_;
              uStack_21f8 = 0;
              local_3e0 = local_21f0;
              uStack_3d8 = uStack_21e8;
              local_3f0 = local_1c90._0_8_;
              uStack_3e8 = 0;
              auVar52._8_8_ = uStack_21e8;
              auVar52._0_8_ = local_21f0;
              auVar51._8_8_ = 0;
              auVar51._0_8_ = local_1c90._0_8_;
              local_2220 = vpavgb_avx(auVar52,auVar51);
              v_00[1] = extraout_RDX_00;
              v_00[0] = uVar110;
              local_1c90 = ZEXT416(local_1c74);
              xx_storel_32((void *)((long)*local_1d48 + (long)local_1d4c),v_00);
              local_1e50 = (__m128i *)((long)*local_1e50 + (long)(local_1d3c << 1));
              local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
              local_1d6c = local_1d6c + -2;
            } while (local_1d6c != 0);
          }
          else {
            local_2240 = (*local_1d38)[0];
            do {
              uVar110 = *(ulong *)((long)*local_1e50 + (long)local_1d3c);
              auVar58._8_8_ = 0;
              auVar58._0_8_ = local_2240;
              auVar57._8_8_ = 0;
              auVar57._0_8_ = uVar110;
              auVar117 = vpavgb_avx(auVar58,auVar57);
              local_2250 = auVar117._0_8_;
              (*local_1d48)[0] = local_2250;
              local_2240 = *(ulong *)((long)*local_1e50 + (long)(local_1d3c * 2));
              auVar56._8_8_ = 0;
              auVar56._0_8_ = uVar110;
              auVar55._8_8_ = 0;
              auVar55._0_8_ = local_2240;
              auVar117 = vpavgb_avx(auVar56,auVar55);
              local_2260 = auVar117._0_8_;
              *(undefined8 *)((long)*local_1d48 + (long)local_1d4c) = local_2260;
              local_1e50 = (__m128i *)((long)*local_1e50 + (long)(local_1d3c << 1));
              local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
              local_1d6c = local_1d6c + -2;
            } while (local_1d6c != 0);
          }
        }
        else if (local_1d50 == 0x10) {
          local_2280 = (*local_1d38)[0];
          lStack_2278 = (*local_1d38)[1];
          do {
            pauVar114 = (undefined1 (*) [16])((long)*local_1e50 + (long)local_1d3c);
            auVar1 = *pauVar114;
            auVar59._8_8_ = lStack_2278;
            auVar59._0_8_ = local_2280;
            auVar117 = vpavgb_avx(auVar59,*pauVar114);
            local_2290 = auVar117._0_8_;
            lStack_2288 = auVar117._8_8_;
            (*local_1d48)[0] = local_2290;
            (*local_1d48)[1] = lStack_2288;
            pauVar114 = (undefined1 (*) [16])((long)*local_1e50 + (long)(local_1d3c << 1));
            local_2280 = *(longlong *)*pauVar114;
            lStack_2278 = *(longlong *)(*pauVar114 + 8);
            auVar117 = vpavgb_avx(auVar1,*pauVar114);
            puVar108 = (undefined8 *)((long)*local_1d48 + (long)local_1d4c);
            local_22a0 = auVar117._0_8_;
            uStack_2298 = auVar117._8_8_;
            *puVar108 = local_22a0;
            puVar108[1] = uStack_2298;
            local_1e50 = (__m128i *)((long)*local_1e50 + (long)(local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else if (local_1d50 == 0x20) {
          local_4f8 = local_1d38;
          local_22e0 = (*local_1d38)[0];
          lStack_22d8 = (*local_1d38)[1];
          lStack_22d0 = local_1d38[1][0];
          lStack_22c8 = local_1d38[1][1];
          local_1e44 = 2;
          do {
            s0[1]._0_4_ = in_stack_ffffffffffffc180;
            s0[0] = (longlong)in_RDX;
            s0[1]._4_4_ = in_ESI;
            s0[2] = (longlong)in_RDI;
            s0[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_2tap_32_avg_avx2
                      ((uint8_t *)CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),s0,
                       (__m256i *)CONCAT44(in_ECX,in_R8D),(uint8_t *)CONCAT44(in_R9D,iVar107));
            s0_00[1]._0_4_ = in_stack_ffffffffffffc180;
            s0_00[0] = (longlong)in_RDX;
            s0_00[1]._4_4_ = in_ESI;
            s0_00[2] = (longlong)in_RDI;
            s0_00[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_2tap_32_avg_avx2
                      ((uint8_t *)CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       s0_00,(__m256i *)CONCAT44(in_ECX,in_R8D),(uint8_t *)CONCAT44(in_R9D,iVar107))
            ;
            local_1e50 = (__m128i *)((long)*local_1e50 + (long)(local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else if (local_1d50 == 0x40) {
          local_4e8 = local_1d38;
          local_2360 = (*local_1d38)[0];
          lStack_2358 = (*local_1d38)[1];
          lStack_2350 = local_1d38[1][0];
          lStack_2348 = local_1d38[1][1];
          local_4f0 = local_1d38 + 2;
          local_2340 = (*local_4f0)[0];
          lStack_2338 = local_1d38[2][1];
          lStack_2330 = local_1d38[3][0];
          lStack_2328 = local_1d38[3][1];
          local_1e44 = 2;
          do {
            s0_01[1]._0_4_ = in_stack_ffffffffffffc180;
            s0_01[0] = (longlong)in_RDX;
            s0_01[1]._4_4_ = in_ESI;
            s0_01[2] = (longlong)in_RDI;
            s0_01[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_2tap_32_avg_avx2
                      ((uint8_t *)CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       s0_01,(__m256i *)CONCAT44(in_ECX,in_R8D),(uint8_t *)CONCAT44(in_R9D,iVar107))
            ;
            s0_02[1]._0_4_ = in_stack_ffffffffffffc180;
            s0_02[0] = (longlong)in_RDX;
            s0_02[1]._4_4_ = in_ESI;
            s0_02[2] = (longlong)in_RDI;
            s0_02[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_2tap_32_avg_avx2
                      ((uint8_t *)CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       s0_02,(__m256i *)CONCAT44(in_ECX,in_R8D),(uint8_t *)CONCAT44(in_R9D,iVar107))
            ;
            s0_03[1]._0_4_ = in_stack_ffffffffffffc180;
            s0_03[0] = (longlong)in_RDX;
            s0_03[1]._4_4_ = in_ESI;
            s0_03[2] = (longlong)in_RDI;
            s0_03[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_2tap_32_avg_avx2
                      ((uint8_t *)CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       s0_03,(__m256i *)CONCAT44(in_ECX,in_R8D),(uint8_t *)CONCAT44(in_R9D,iVar107))
            ;
            s0_04[1]._0_4_ = in_stack_ffffffffffffc180;
            s0_04[0] = (longlong)in_RDX;
            s0_04[1]._4_4_ = in_ESI;
            s0_04[2] = (longlong)in_RDI;
            s0_04[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_2tap_32_avg_avx2
                      ((uint8_t *)CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       s0_04,(__m256i *)CONCAT44(in_ECX,in_R8D),(uint8_t *)CONCAT44(in_R9D,iVar107))
            ;
            local_1e50 = (__m128i *)((long)*local_1e50 + (long)(local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else {
          local_4c8 = local_1d38;
          local_2460 = (*local_1d38)[0];
          lStack_2458 = (*local_1d38)[1];
          lStack_2450 = local_1d38[1][0];
          lStack_2448 = local_1d38[1][1];
          local_4d0 = local_1d38 + 2;
          local_2440 = (*local_4d0)[0];
          lStack_2438 = local_1d38[2][1];
          lStack_2430 = local_1d38[3][0];
          lStack_2428 = local_1d38[3][1];
          local_4d8 = local_1d38 + 4;
          local_2420 = (*local_4d8)[0];
          lStack_2418 = local_1d38[4][1];
          lStack_2410 = local_1d38[5][0];
          lStack_2408 = local_1d38[5][1];
          local_4e0 = local_1d38 + 6;
          local_2400 = (*local_4e0)[0];
          lStack_23f8 = local_1d38[6][1];
          lStack_23f0 = local_1d38[7][0];
          lStack_23e8 = local_1d38[7][1];
          local_1e44 = 2;
          do {
            s0_05[1]._0_4_ = in_stack_ffffffffffffc180;
            s0_05[0] = (longlong)in_RDX;
            s0_05[1]._4_4_ = in_ESI;
            s0_05[2] = (longlong)in_RDI;
            s0_05[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_2tap_32_avg_avx2
                      ((uint8_t *)CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       s0_05,(__m256i *)CONCAT44(in_ECX,in_R8D),(uint8_t *)CONCAT44(in_R9D,iVar107))
            ;
            s0_06[1]._0_4_ = in_stack_ffffffffffffc180;
            s0_06[0] = (longlong)in_RDX;
            s0_06[1]._4_4_ = in_ESI;
            s0_06[2] = (longlong)in_RDI;
            s0_06[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_2tap_32_avg_avx2
                      ((uint8_t *)CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       s0_06,(__m256i *)CONCAT44(in_ECX,in_R8D),(uint8_t *)CONCAT44(in_R9D,iVar107))
            ;
            s0_07[1]._0_4_ = in_stack_ffffffffffffc180;
            s0_07[0] = (longlong)in_RDX;
            s0_07[1]._4_4_ = in_ESI;
            s0_07[2] = (longlong)in_RDI;
            s0_07[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_2tap_32_avg_avx2
                      ((uint8_t *)CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       s0_07,(__m256i *)CONCAT44(in_ECX,in_R8D),(uint8_t *)CONCAT44(in_R9D,iVar107))
            ;
            s0_08[1]._0_4_ = in_stack_ffffffffffffc180;
            s0_08[0] = (longlong)in_RDX;
            s0_08[1]._4_4_ = in_ESI;
            s0_08[2] = (longlong)in_RDI;
            s0_08[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_2tap_32_avg_avx2
                      ((uint8_t *)CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       s0_08,(__m256i *)CONCAT44(in_ECX,in_R8D),(uint8_t *)CONCAT44(in_R9D,iVar107))
            ;
            s0_09[1]._0_4_ = in_stack_ffffffffffffc180;
            s0_09[0] = (longlong)in_RDX;
            s0_09[1]._4_4_ = in_ESI;
            s0_09[2] = (longlong)in_RDI;
            s0_09[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_2tap_32_avg_avx2
                      ((uint8_t *)CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       s0_09,(__m256i *)CONCAT44(in_ECX,in_R8D),(uint8_t *)CONCAT44(in_R9D,iVar107))
            ;
            s0_10[1]._0_4_ = in_stack_ffffffffffffc180;
            s0_10[0] = (longlong)in_RDX;
            s0_10[1]._4_4_ = in_ESI;
            s0_10[2] = (longlong)in_RDI;
            s0_10[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_2tap_32_avg_avx2
                      ((uint8_t *)CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       s0_10,(__m256i *)CONCAT44(in_ECX,in_R8D),(uint8_t *)CONCAT44(in_R9D,iVar107))
            ;
            s0_11[1]._0_4_ = in_stack_ffffffffffffc180;
            s0_11[0] = (longlong)in_RDX;
            s0_11[1]._4_4_ = in_ESI;
            s0_11[2] = (longlong)in_RDI;
            s0_11[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_2tap_32_avg_avx2
                      ((uint8_t *)CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       s0_11,(__m256i *)CONCAT44(in_ECX,in_R8D),(uint8_t *)CONCAT44(in_R9D,iVar107))
            ;
            s0_12[1]._0_4_ = in_stack_ffffffffffffc180;
            s0_12[0] = (longlong)in_RDX;
            s0_12[1]._4_4_ = in_ESI;
            s0_12[2] = (longlong)in_RDI;
            s0_12[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_2tap_32_avg_avx2
                      ((uint8_t *)CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       s0_12,(__m256i *)CONCAT44(in_ECX,in_R8D),(uint8_t *)CONCAT44(in_R9D,iVar107))
            ;
            local_1e50 = (__m128i *)((long)*local_1e50 + (long)(local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
      }
      else if (local_1d50 < 9) {
        prepare_half_coeffs_2tap_ssse3
                  ((InterpFilterParams *)CONCAT44(in_ECX,in_R8D),in_R9D,
                   (__m128i *)in_stack_ffffffffffffc160);
        if (local_1d50 == 2) {
          local_1d14 = (uint)(short)(*local_1e50)[0];
          local_1d30._4_4_ = 0;
          local_1d30._0_4_ = local_1d14;
          local_1d30._8_8_ = 0;
          local_1e70[0] = local_1d30._0_8_;
          local_1e70[1] = 0;
          uVar110 = local_1d30._0_8_;
          uVar119 = local_1d30._8_8_;
          local_1d30 = ZEXT416(local_1d14);
          do {
            lVar111 = (long)local_1d3c;
            puVar109 = local_1e70;
            palVar112 = local_1e50;
            y_convolve_2tap_2x2_ssse3
                      ((uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffc180),(ptrdiff_t)in_RDX,
                       (__m128i *)CONCAT44(in_ECX,in_R8D),(__m128i *)CONCAT44(in_R9D,iVar107));
            src_00[1] = lVar111;
            src_00[0] = (longlong)palVar112;
            local_1e80 = uVar110;
            uStack_1e78 = uVar119;
            alVar123 = sr_y_round_sse2(src_00);
            res_17[1] = (long)local_1d4c;
            res_17[0] = (longlong)local_1d48;
            local_1e90 = uVar110;
            uStack_1e88 = uVar119;
            pack_store_2x2_sse2(res_17,alVar123[1],(ptrdiff_t)puVar109);
            local_1e50 = (__m128i *)((long)*local_1e50 + (long)(local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else if (local_1d50 == 4) {
          local_1cf4 = loadu_int32(local_1e50);
          local_1d10._4_4_ = 0;
          local_1d10._0_4_ = local_1cf4;
          local_1d10._8_8_ = 0;
          local_1eb0 = local_1d10._0_8_;
          uStack_1ea8 = 0;
          uVar110 = local_1d10._0_8_;
          uVar119 = local_1d10._8_8_;
          local_1d10 = ZEXT416(local_1cf4);
          do {
            lVar111 = (long)local_1d3c;
            palVar112 = local_1e50;
            y_convolve_2tap_4x2_ssse3
                      ((uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffc180),(ptrdiff_t)in_RDX,
                       (__m128i *)CONCAT44(in_ECX,in_R8D),(__m128i *)CONCAT44(in_R9D,iVar107));
            src_01[1] = lVar111;
            src_01[0] = (longlong)palVar112;
            local_1ec0 = uVar110;
            uStack_1eb8 = uVar119;
            sr_y_round_sse2(src_01);
            res_11[1] = (longlong)in_stack_ffffffffffffc160;
            res_11[0] = in_stack_ffffffffffffc158;
            local_1ed0 = uVar110;
            uStack_1ec8 = uVar119;
            pack_store_4x2_sse2(res_11,(uint8_t *)
                                       CONCAT44(in_stack_ffffffffffffc154,in_stack_ffffffffffffc150)
                                ,CONCAT44(in_stack_ffffffffffffc14c,in_stack_ffffffffffffc148));
            local_1e50 = (__m128i *)((long)*local_1e50 + (long)(local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else {
          local_998 = local_1e50;
          local_1ef0 = (*local_1e50)[0];
          uStack_9a8 = 0;
          uStack_1ee8 = 0;
          local_9b0 = local_1ef0;
          do {
            local_9b8 = (ulong *)((long)*local_1e50 + (long)local_1d3c);
            local_1ee0 = *local_9b8;
            uStack_9c8 = 0;
            uStack_1ed8 = 0;
            local_720 = local_1ef0;
            uStack_718 = uStack_1ee8;
            uStack_728 = 0;
            auVar44._8_8_ = uStack_1ee8;
            auVar44._0_8_ = local_1ef0;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = local_1ee0;
            local_1f10 = vpunpcklqdq_avx(auVar44,auVar43);
            local_9d8 = (ulong *)((long)*local_1e50 + (long)(local_1d3c * 2));
            local_1ef0 = *local_9d8;
            uStack_9e8 = 0;
            uStack_1ee8 = 0;
            uStack_738 = 0;
            uStack_748 = 0;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = local_1ee0;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = local_1ef0;
            local_1f00 = vpunpcklqdq_avx(auVar42,auVar41);
            local_700 = local_1f10._0_8_;
            uStack_6f8 = local_1f10._8_8_;
            local_710 = local_1f00._0_8_;
            uStack_708 = local_1f00._8_8_;
            local_1f20 = (__m128i)vpunpcklbw_avx(local_1f10,local_1f00);
            local_560 = local_1f10._0_8_;
            uStack_558 = local_1f10._8_8_;
            local_570 = local_1f00._0_8_;
            uStack_568 = local_1f00._8_8_;
            alVar123 = (__m128i)vpunpckhbw_avx(local_1f10,local_1f00);
            palVar112 = (__m128i *)local_1db0;
            local_1f30 = alVar123;
            local_9f0 = local_1ef0;
            local_9d0 = local_1ee0;
            local_750 = local_1ef0;
            local_740 = local_1ee0;
            local_730 = local_1ee0;
            convolve_2tap_ssse3(&local_1f20,palVar112);
            ss = &local_1f30;
            local_1f40 = alVar123;
            convolve_2tap_ssse3(ss,palVar112);
            src_02[1] = (longlong)palVar112;
            src_02[0] = (longlong)ss;
            lVar115 = local_1f40[0];
            lVar120 = local_1f40[1];
            local_1f50 = alVar123;
            sr_y_round_sse2(src_02);
            src_03[1] = (longlong)palVar112;
            src_03[0] = (longlong)ss;
            lVar116 = local_1f50[0];
            lVar121 = local_1f50[1];
            local_1f60 = lVar115;
            lStack_1f58 = lVar120;
            alVar123 = sr_y_round_sse2(src_03);
            s_65[1] = alVar123[1];
            local_540 = local_1f60;
            lStack_538 = lStack_1f58;
            auVar46._8_8_ = lStack_1f58;
            auVar46._0_8_ = local_1f60;
            auVar45._8_8_ = lVar121;
            auVar45._0_8_ = lVar116;
            local_1f80 = vpackuswb_avx(auVar46,auVar45);
            local_a78 = local_1d48;
            local_a90 = local_1f80._0_8_;
            uStack_a88 = local_1f80._8_8_;
            (*local_1d48)[0] = local_1f80._0_8_;
            s_65[0] = (longlong)palVar112;
            local_1f70 = lVar116;
            lStack_1f68 = lVar121;
            local_550 = lVar116;
            lStack_548 = lVar121;
            _mm_storeh_epi64((__m128i *)((long)*local_1d48 + (long)local_1d4c),s_65);
            local_1e50 = (__m128i *)((long)*local_1e50 + (long)(local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
      }
      else {
        prepare_half_coeffs_2tap_avx2
                  (in_stack_ffffffffffffc1b0,in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a0);
        if (local_1d50 == 0x10) {
          local_1878 = local_1e50;
          local_1fa0 = (*local_1e50)[0];
          lStack_1f98 = (*local_1e50)[1];
          do {
            y_convolve_2tap_16x2_avx2
                      (in_stack_ffffffffffffc1e0,in_stack_ffffffffffffc1d8,in_stack_ffffffffffffc1d0
                       ,in_stack_ffffffffffffc1c8,in_stack_ffffffffffffc1c0);
            sr_y_round_store_16x2_avx2
                      (in_stack_ffffffffffffc1a0,(uint8_t *)in_stack_ffffffffffffc198,
                       (ptrdiff_t)in_stack_ffffffffffffc190);
            local_1e50 = (__m128i *)((long)*local_1e50 + (long)(local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else if (local_1d50 == 0x20) {
          local_530 = local_1e50;
          local_2020 = (*local_1e50)[0];
          lStack_2018 = (*local_1e50)[1];
          lStack_2010 = local_1e50[1][0];
          lStack_2008 = local_1e50[1][1];
          do {
            s0_13[1] = (longlong)in_stack_ffffffffffffc1a0;
            s0_13[0] = (longlong)in_stack_ffffffffffffc198;
            s0_13[2]._0_4_ = in_stack_ffffffffffffc1a8;
            s0_13[2]._4_4_ = in_stack_ffffffffffffc1ac;
            s0_13[3] = (longlong)in_stack_ffffffffffffc1b0;
            sr_y_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8,s0_13,
                              in_stack_ffffffffffffc190,(uint8_t *)in_RDI);
            s0_14[1] = (longlong)in_stack_ffffffffffffc1a0;
            s0_14[0] = (longlong)in_stack_ffffffffffffc198;
            s0_14[2]._0_4_ = in_stack_ffffffffffffc1a8;
            s0_14[2]._4_4_ = in_stack_ffffffffffffc1ac;
            s0_14[3] = (longlong)in_stack_ffffffffffffc1b0;
            sr_y_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8,s0_14,
                              in_stack_ffffffffffffc190,(uint8_t *)in_RDI);
            local_1e50 = (__m128i *)((long)*local_1e50 + (long)(local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else if (local_1d50 == 0x40) {
          local_520 = local_1e50;
          local_20a0 = (*local_1e50)[0];
          lStack_2098 = (*local_1e50)[1];
          lStack_2090 = local_1e50[1][0];
          lStack_2088 = local_1e50[1][1];
          local_528 = local_1e50 + 2;
          local_2080 = (*local_528)[0];
          lStack_2078 = local_1e50[2][1];
          lStack_2070 = local_1e50[3][0];
          lStack_2068 = local_1e50[3][1];
          do {
            s0_15[1] = (longlong)in_stack_ffffffffffffc1a0;
            s0_15[0] = (longlong)in_stack_ffffffffffffc198;
            s0_15[2]._0_4_ = in_stack_ffffffffffffc1a8;
            s0_15[2]._4_4_ = in_stack_ffffffffffffc1ac;
            s0_15[3] = (longlong)in_stack_ffffffffffffc1b0;
            sr_y_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8,s0_15,
                              in_stack_ffffffffffffc190,(uint8_t *)in_RDI);
            s0_16[1] = (longlong)in_stack_ffffffffffffc1a0;
            s0_16[0] = (longlong)in_stack_ffffffffffffc198;
            s0_16[2]._0_4_ = in_stack_ffffffffffffc1a8;
            s0_16[2]._4_4_ = in_stack_ffffffffffffc1ac;
            s0_16[3] = (longlong)in_stack_ffffffffffffc1b0;
            sr_y_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8,s0_16,
                              in_stack_ffffffffffffc190,(uint8_t *)in_RDI);
            s0_17[1] = (longlong)in_stack_ffffffffffffc1a0;
            s0_17[0] = (longlong)in_stack_ffffffffffffc198;
            s0_17[2]._0_4_ = in_stack_ffffffffffffc1a8;
            s0_17[2]._4_4_ = in_stack_ffffffffffffc1ac;
            s0_17[3] = (longlong)in_stack_ffffffffffffc1b0;
            sr_y_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8,s0_17,
                              in_stack_ffffffffffffc190,(uint8_t *)in_RDI);
            s0_18[1] = (longlong)in_stack_ffffffffffffc1a0;
            s0_18[0] = (longlong)in_stack_ffffffffffffc198;
            s0_18[2]._0_4_ = in_stack_ffffffffffffc1a8;
            s0_18[2]._4_4_ = in_stack_ffffffffffffc1ac;
            s0_18[3] = (longlong)in_stack_ffffffffffffc1b0;
            sr_y_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8,s0_18,
                              in_stack_ffffffffffffc190,(uint8_t *)in_RDI);
            local_1e50 = (__m128i *)((long)*local_1e50 + (long)(local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else {
          local_500 = local_1e50;
          local_21a0 = (*local_1e50)[0];
          lStack_2198 = (*local_1e50)[1];
          lStack_2190 = local_1e50[1][0];
          lStack_2188 = local_1e50[1][1];
          local_508 = local_1e50 + 2;
          local_2180 = (*local_508)[0];
          lStack_2178 = local_1e50[2][1];
          lStack_2170 = local_1e50[3][0];
          lStack_2168 = local_1e50[3][1];
          local_510 = local_1e50 + 4;
          local_2160 = (*local_510)[0];
          lStack_2158 = local_1e50[4][1];
          lStack_2150 = local_1e50[5][0];
          lStack_2148 = local_1e50[5][1];
          local_518 = local_1e50 + 6;
          local_2140 = (*local_518)[0];
          lStack_2138 = local_1e50[6][1];
          lStack_2130 = local_1e50[7][0];
          lStack_2128 = local_1e50[7][1];
          do {
            s0_19[1] = (longlong)in_stack_ffffffffffffc1a0;
            s0_19[0] = (longlong)in_stack_ffffffffffffc198;
            s0_19[2]._0_4_ = in_stack_ffffffffffffc1a8;
            s0_19[2]._4_4_ = in_stack_ffffffffffffc1ac;
            s0_19[3] = (longlong)in_stack_ffffffffffffc1b0;
            sr_y_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8,s0_19,
                              in_stack_ffffffffffffc190,(uint8_t *)in_RDI);
            s0_20[1] = (longlong)in_stack_ffffffffffffc1a0;
            s0_20[0] = (longlong)in_stack_ffffffffffffc198;
            s0_20[2]._0_4_ = in_stack_ffffffffffffc1a8;
            s0_20[2]._4_4_ = in_stack_ffffffffffffc1ac;
            s0_20[3] = (longlong)in_stack_ffffffffffffc1b0;
            sr_y_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8,s0_20,
                              in_stack_ffffffffffffc190,(uint8_t *)in_RDI);
            s0_21[1] = (longlong)in_stack_ffffffffffffc1a0;
            s0_21[0] = (longlong)in_stack_ffffffffffffc198;
            s0_21[2]._0_4_ = in_stack_ffffffffffffc1a8;
            s0_21[2]._4_4_ = in_stack_ffffffffffffc1ac;
            s0_21[3] = (longlong)in_stack_ffffffffffffc1b0;
            sr_y_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8,s0_21,
                              in_stack_ffffffffffffc190,(uint8_t *)in_RDI);
            s0_22[1] = (longlong)in_stack_ffffffffffffc1a0;
            s0_22[0] = (longlong)in_stack_ffffffffffffc198;
            s0_22[2]._0_4_ = in_stack_ffffffffffffc1a8;
            s0_22[2]._4_4_ = in_stack_ffffffffffffc1ac;
            s0_22[3] = (longlong)in_stack_ffffffffffffc1b0;
            sr_y_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8,s0_22,
                              in_stack_ffffffffffffc190,(uint8_t *)in_RDI);
            s0_23[1] = (longlong)in_stack_ffffffffffffc1a0;
            s0_23[0] = (longlong)in_stack_ffffffffffffc198;
            s0_23[2]._0_4_ = in_stack_ffffffffffffc1a8;
            s0_23[2]._4_4_ = in_stack_ffffffffffffc1ac;
            s0_23[3] = (longlong)in_stack_ffffffffffffc1b0;
            sr_y_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8,s0_23,
                              in_stack_ffffffffffffc190,(uint8_t *)in_RDI);
            s0_24[1] = (longlong)in_stack_ffffffffffffc1a0;
            s0_24[0] = (longlong)in_stack_ffffffffffffc198;
            s0_24[2]._0_4_ = in_stack_ffffffffffffc1a8;
            s0_24[2]._4_4_ = in_stack_ffffffffffffc1ac;
            s0_24[3] = (longlong)in_stack_ffffffffffffc1b0;
            sr_y_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8,s0_24,
                              in_stack_ffffffffffffc190,(uint8_t *)in_RDI);
            s0_25[1] = (longlong)in_stack_ffffffffffffc1a0;
            s0_25[0] = (longlong)in_stack_ffffffffffffc198;
            s0_25[2]._0_4_ = in_stack_ffffffffffffc1a8;
            s0_25[2]._4_4_ = in_stack_ffffffffffffc1ac;
            s0_25[3] = (longlong)in_stack_ffffffffffffc1b0;
            sr_y_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8,s0_25,
                              in_stack_ffffffffffffc190,(uint8_t *)in_RDI);
            s0_26[1] = (longlong)in_stack_ffffffffffffc1a0;
            s0_26[0] = (longlong)in_stack_ffffffffffffc198;
            s0_26[2]._0_4_ = in_stack_ffffffffffffc1a8;
            s0_26[2]._4_4_ = in_stack_ffffffffffffc1ac;
            s0_26[3] = (longlong)in_stack_ffffffffffffc1b0;
            sr_y_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8,s0_26,
                              in_stack_ffffffffffffc190,(uint8_t *)in_RDI);
            local_1e50 = (__m128i *)((long)*local_1e50 + (long)(local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
      }
    }
    else if (local_1e44 == 4) {
      local_2468 = (undefined1 (*) [32])((long)local_1d38 - (long)local_1d3c);
      local_1d6c = local_1d54;
      if (local_1d50 < 5) {
        prepare_half_coeffs_4tap_ssse3
                  ((InterpFilterParams *)CONCAT44(in_ECX,in_R8D),in_R9D,
                   (__m128i *)in_stack_ffffffffffffc160);
        if (local_1d50 == 2) {
          iVar106 = loadu_int16(local_2468);
          local_1bd4 = (uint)iVar106;
          local_1bf0._4_4_ = 0;
          local_1bf0._0_4_ = local_1bd4;
          local_24b0 = local_1bf0._0_8_;
          uStack_24a8 = 0;
          local_1bf0 = ZEXT416(local_1bd4);
          iVar106 = loadu_int16(*local_2468 + local_1d3c);
          local_1bf4 = (uint)iVar106;
          local_1c10._4_4_ = 0;
          local_1c10._0_4_ = local_1bf4;
          local_24a0 = local_1c10._0_8_;
          uStack_2498 = 0;
          local_1c10 = ZEXT416(local_1bf4);
          iVar106 = loadu_int16(*local_2468 + local_1d3c * 2);
          local_1c14 = (uint)iVar106;
          local_1c30._4_4_ = 0;
          local_1c30._0_4_ = local_1c14;
          local_2490 = local_1c30._0_8_;
          uStack_2488 = 0;
          local_300 = local_24b0;
          uStack_2f8 = uStack_24a8;
          local_310 = local_24a0;
          uStack_308 = uStack_2498;
          auVar63._8_8_ = uStack_24a8;
          auVar63._0_8_ = local_24b0;
          auVar62._8_8_ = uStack_2498;
          auVar62._0_8_ = local_24a0;
          local_24e0 = vpunpcklwd_avx(auVar63,auVar62);
          local_320 = local_24a0;
          uStack_318 = uStack_2498;
          local_330 = local_1c30._0_8_;
          uStack_328 = 0;
          auVar61._8_8_ = uStack_2498;
          auVar61._0_8_ = local_24a0;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = local_1c30._0_8_;
          local_24f0 = vpunpcklwd_avx(auVar61,auVar60);
          local_6e0 = local_24e0._0_8_;
          uStack_6d8 = local_24e0._8_8_;
          local_6f0 = local_24f0._0_8_;
          uStack_6e8 = local_24f0._8_8_;
          local_24d0 = vpunpcklbw_avx(local_24e0,local_24f0);
          local_1c30 = ZEXT416(local_1c14);
          do {
            pauVar113 = (undefined1 (*) [32])(*local_2468 + (local_1d3c << 1));
            lVar111 = (long)local_1d3c;
            puVar109 = &local_24b0;
            auVar117 = local_24d0;
            local_2468 = pauVar113;
            y_convolve_4tap_2x2_ssse3
                      ((uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffc180),(ptrdiff_t)in_RDX,
                       (__m128i *)CONCAT44(in_ECX,in_R8D),(__m128i *)CONCAT44(in_R9D,iVar107),
                       (__m128i *)in_stack_ffffffffffffc160);
            local_2500._0_8_ = auVar117._0_8_;
            local_2500._8_8_ = auVar117._8_8_;
            src_04[1] = lVar111;
            src_04[0] = (longlong)pauVar113;
            uVar119 = local_2500._0_8_;
            uVar122 = local_2500._8_8_;
            local_2500 = auVar117;
            alVar123 = sr_y_round_sse2(src_04);
            res_18[1] = (long)local_1d4c;
            res_18[0] = (longlong)local_1d48;
            local_2510 = uVar119;
            uStack_2508 = uVar122;
            pack_store_2x2_sse2(res_18,alVar123[1],(ptrdiff_t)puVar109);
            local_24d0 = local_24c0;
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else {
          local_1b74 = loadu_int32(local_2468);
          local_1b90._4_4_ = 0;
          local_1b90._0_4_ = local_1b74;
          local_2550 = local_1b90._0_8_;
          uStack_2548 = 0;
          local_1b90 = ZEXT416(local_1b74);
          local_1b94 = loadu_int32(*local_2468 + local_1d3c);
          local_1bb0._4_4_ = 0;
          local_1bb0._0_4_ = local_1b94;
          local_2540 = local_1bb0._0_8_;
          uStack_2538 = 0;
          local_1bb0 = ZEXT416(local_1b94);
          local_1bb4 = loadu_int32(*local_2468 + local_1d3c * 2);
          local_1bd0._4_4_ = 0;
          local_1bd0._0_4_ = local_1bb4;
          local_2530 = local_1bd0._0_8_;
          uStack_2528 = 0;
          local_180 = local_2550;
          uStack_178 = uStack_2548;
          local_190 = local_2540;
          uStack_188 = uStack_2538;
          auVar87._8_8_ = uStack_2548;
          auVar87._0_8_ = local_2550;
          auVar86._8_8_ = uStack_2538;
          auVar86._0_8_ = local_2540;
          local_2580 = vpunpckldq_avx(auVar87,auVar86);
          local_1a0 = local_2540;
          uStack_198 = uStack_2538;
          local_1b0 = local_1bd0._0_8_;
          uStack_1a8 = 0;
          auVar85._8_8_ = uStack_2538;
          auVar85._0_8_ = local_2540;
          auVar84._8_8_ = 0;
          auVar84._0_8_ = local_1bd0._0_8_;
          local_2590 = vpunpckldq_avx(auVar85,auVar84);
          local_6c0 = local_2580._0_8_;
          uStack_6b8 = local_2580._8_8_;
          local_6d0 = local_2590._0_8_;
          uStack_6c8 = local_2590._8_8_;
          local_2570 = vpunpcklbw_avx(local_2580,local_2590);
          local_1bd0 = ZEXT416(local_1bb4);
          do {
            pauVar113 = (undefined1 (*) [32])(*local_2468 + (local_1d3c << 1));
            lVar111 = (long)local_1d3c;
            auVar117 = local_2570;
            local_2468 = pauVar113;
            y_convolve_4tap_4x2_ssse3
                      ((uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffc180),(ptrdiff_t)in_RDX,
                       (__m128i *)CONCAT44(in_ECX,in_R8D),(__m128i *)CONCAT44(in_R9D,iVar107),
                       (__m128i *)in_stack_ffffffffffffc160);
            local_25a0._0_8_ = auVar117._0_8_;
            local_25a0._8_8_ = auVar117._8_8_;
            src_05[1] = lVar111;
            src_05[0] = (longlong)pauVar113;
            uVar119 = local_25a0._0_8_;
            uVar122 = local_25a0._8_8_;
            local_25a0 = auVar117;
            sr_y_round_sse2(src_05);
            res_12[1] = (longlong)in_stack_ffffffffffffc160;
            res_12[0] = in_stack_ffffffffffffc158;
            local_25b0 = uVar119;
            uStack_25a8 = uVar122;
            pack_store_4x2_sse2(res_12,(uint8_t *)
                                       CONCAT44(in_stack_ffffffffffffc154,in_stack_ffffffffffffc150)
                                ,CONCAT44(in_stack_ffffffffffffc14c,in_stack_ffffffffffffc148));
            local_2570 = local_2560;
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
      }
      else {
        prepare_half_coeffs_4tap_avx2
                  ((InterpFilterParams *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffc160);
        if (local_1d50 == 8) {
          local_8d8 = local_2468;
          local_2660 = *(ulong *)*local_2468;
          uStack_8e8 = 0;
          uStack_25e8 = 0;
          local_8f8 = (ulong *)(*local_2468 + local_1d3c);
          local_2680 = *local_8f8;
          uStack_908 = 0;
          uStack_25d8 = 0;
          local_918 = (undefined8 *)(*local_2468 + local_1d3c * 2);
          uStack_2670 = *local_918;
          uStack_928 = 0;
          uStack_25c8 = 0;
          uStack_17c8 = 0;
          uStack_2648 = 0;
          uStack_2658 = 0;
          uStack_17d8 = 0;
          uStack_2668 = 0;
          uStack_2678 = 0;
          uStack_1638 = 0;
          uStack_1628 = 0;
          uStack_1658 = 0;
          uStack_1648 = 0;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_2660;
          auVar7._16_8_ = local_2680;
          auVar7._24_8_ = 0;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_2680;
          auVar6._16_8_ = uStack_2670;
          auVar6._24_8_ = 0;
          local_2640 = vpunpcklbw_avx2(auVar7,auVar6);
          uStack_2650 = local_2680;
          local_25f0 = local_2660;
          local_25e0 = local_2680;
          local_25d0 = uStack_2670;
          local_17e0 = local_2680;
          local_17d0 = local_2660;
          local_1660 = local_2680;
          uStack_1650 = uStack_2670;
          local_1640 = local_2660;
          uStack_1630 = local_2680;
          local_930 = uStack_2670;
          local_910 = local_2680;
          local_8f0 = local_2660;
          do {
            local_2468 = (undefined1 (*) [32])(*local_2468 + (local_1d3c << 1));
            auVar118 = local_2640;
            y_convolve_4tap_8x2_avx2
                      ((uint8_t *)in_stack_ffffffffffffc1b0,
                       CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       in_stack_ffffffffffffc1a0,in_stack_ffffffffffffc198,in_stack_ffffffffffffc190
                      );
            res_14[1]._0_4_ = in_stack_ffffffffffffc180;
            res_14[0] = (longlong)in_RDX;
            res_14[1]._4_4_ = in_ESI;
            res_14[2] = (longlong)in_RDI;
            res_14[3] = (longlong)in_stack_ffffffffffffc190;
            local_26a0 = auVar118;
            sr_y_round_store_8x2_avx2
                      (res_14,(uint8_t *)CONCAT44(in_ECX,in_R8D),CONCAT44(in_R9D,iVar107));
            local_2640 = local_2620;
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else if (local_1d50 == 0x10) {
          local_1848 = local_2468;
          local_27c0 = *(undefined8 *)*local_2468;
          uStack_27b8 = *(undefined8 *)(*local_2468 + 8);
          local_1850 = (undefined1 (*) [16])(*local_2468 + local_1d3c);
          local_27e0 = *(undefined8 *)*local_1850;
          uStack_27d8 = *(undefined8 *)(*local_1850 + 8);
          local_1858 = (undefined8 *)(*local_2468 + local_1d3c * 2);
          uStack_27d0 = *local_1858;
          uStack_27c8 = local_1858[1];
          auVar9._16_8_ = local_27e0;
          auVar9._0_16_ = *(undefined1 (*) [16])*local_2468;
          auVar9._24_8_ = uStack_27d8;
          auVar8._16_8_ = uStack_27d0;
          auVar8._0_16_ = *local_1850;
          auVar8._24_8_ = uStack_27c8;
          local_2760 = vpunpcklbw_avx2(auVar9,auVar8);
          auVar30._16_8_ = local_27e0;
          auVar30._0_16_ = *(undefined1 (*) [16])*local_2468;
          auVar30._24_8_ = uStack_27d8;
          auVar29._16_8_ = uStack_27d0;
          auVar29._0_16_ = *local_1850;
          auVar29._24_8_ = uStack_27c8;
          local_2720 = vpunpckhbw_avx2(auVar30,auVar29);
          uStack_27b0 = local_27e0;
          uStack_27a8 = uStack_27d8;
          local_26e0 = local_27c0;
          uStack_26d8 = uStack_27b8;
          local_26d0 = local_27e0;
          uStack_26c8 = uStack_27d8;
          local_26c0 = uStack_27d0;
          uStack_26b8 = uStack_27c8;
          local_17c0 = local_27e0;
          uStack_17b8 = uStack_27d8;
          local_17b0 = local_27c0;
          uStack_17a8 = uStack_27b8;
          local_1620 = local_27e0;
          uStack_1618 = uStack_27d8;
          uStack_1610 = uStack_27d0;
          uStack_1608 = uStack_27c8;
          local_1600 = local_27c0;
          uStack_15f8 = uStack_27b8;
          uStack_15f0 = local_27e0;
          uStack_15e8 = uStack_27d8;
          local_fe0 = local_27e0;
          uStack_fd8 = uStack_27d8;
          uStack_fd0 = uStack_27d0;
          uStack_fc8 = uStack_27c8;
          local_fc0 = local_27c0;
          uStack_fb8 = uStack_27b8;
          uStack_fb0 = local_27e0;
          uStack_fa8 = uStack_27d8;
          do {
            local_2468 = (undefined1 (*) [32])(*local_2468 + (local_1d3c << 1));
            y_convolve_4tap_16x2_avx2
                      ((uint8_t *)in_stack_ffffffffffffc1a0,(ptrdiff_t)in_stack_ffffffffffffc198,
                       in_stack_ffffffffffffc190,in_RDI,
                       (__m256i *)CONCAT44(in_ESI,in_stack_ffffffffffffc180),in_RDX);
            sr_y_round_store_16x2_avx2
                      (in_stack_ffffffffffffc1a0,(uint8_t *)in_stack_ffffffffffffc198,
                       (ptrdiff_t)in_stack_ffffffffffffc190);
            local_2760._8_8_ = uStack_2738;
            local_2760._0_8_ = local_2740;
            local_2760._16_8_ = uStack_2730;
            local_2760._24_8_ = uStack_2728;
            local_2720._8_8_ = uStack_26f8;
            local_2720._0_8_ = local_2700;
            local_2720._16_8_ = uStack_26f0;
            local_2720._24_8_ = uStack_26e8;
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else if (local_1d50 == 0x20) {
          local_4b0 = local_2468;
          local_2860 = *(undefined8 *)*local_2468;
          uStack_2858 = *(undefined8 *)(*local_2468 + 8);
          uStack_2850 = *(undefined8 *)(*local_2468 + 0x10);
          uStack_2848 = *(undefined8 *)(*local_2468 + 0x18);
          local_4b8 = (undefined1 (*) [32])(*local_2468 + local_1d3c);
          local_2840 = *(undefined8 *)*local_4b8;
          uStack_2838 = *(undefined8 *)(*local_4b8 + 8);
          uStack_2830 = *(undefined8 *)(*local_4b8 + 0x10);
          uStack_2828 = *(undefined8 *)(*local_4b8 + 0x18);
          local_4c0 = (undefined1 (*) [32])(*local_2468 + local_1d3c * 2);
          local_2820 = *(undefined8 *)*local_4c0;
          uStack_2818 = *(undefined8 *)(*local_4c0 + 8);
          uStack_2810 = *(undefined8 *)(*local_4c0 + 0x10);
          uStack_2808 = *(undefined8 *)(*local_4c0 + 0x18);
          local_28e0 = vpunpcklbw_avx2(*local_2468,*local_4b8);
          local_28a0 = vpunpckhbw_avx2(*local_2468,*local_4b8);
          local_2960 = vpunpcklbw_avx2(*local_4b8,*local_4c0);
          local_2920 = vpunpckhbw_avx2(*local_4b8,*local_4c0);
          local_15e0 = local_2820;
          uStack_15d8 = uStack_2818;
          uStack_15d0 = uStack_2810;
          uStack_15c8 = uStack_2808;
          local_15c0 = local_2840;
          uStack_15b8 = uStack_2838;
          uStack_15b0 = uStack_2830;
          uStack_15a8 = uStack_2828;
          local_15a0 = local_2840;
          uStack_1598 = uStack_2838;
          uStack_1590 = uStack_2830;
          uStack_1588 = uStack_2828;
          local_1580 = local_2860;
          uStack_1578 = uStack_2858;
          uStack_1570 = uStack_2850;
          uStack_1568 = uStack_2848;
          local_fa0 = local_2820;
          uStack_f98 = uStack_2818;
          uStack_f90 = uStack_2810;
          uStack_f88 = uStack_2808;
          local_f80 = local_2840;
          uStack_f78 = uStack_2838;
          uStack_f70 = uStack_2830;
          uStack_f68 = uStack_2828;
          local_f60 = local_2840;
          uStack_f58 = uStack_2838;
          uStack_f50 = uStack_2830;
          uStack_f48 = uStack_2828;
          local_f40 = local_2860;
          uStack_f38 = uStack_2858;
          uStack_f30 = uStack_2850;
          uStack_f28 = uStack_2848;
          do {
            local_2468 = (undefined1 (*) [32])(*local_2468 + (local_1d3c << 1));
            puVar124 = local_29e0;
            y_convolve_4tap_32x2_avx2();
            sr_y_round_store_32x2_avx2
                      ((__m256i *)CONCAT44(in_stack_ffffffffffffc14c,in_stack_ffffffffffffc148),
                       puVar124,0);
            local_28e0._8_8_ = uStack_28b8;
            local_28e0._0_8_ = local_28c0;
            local_28e0._16_8_ = uStack_28b0;
            local_28e0._24_8_ = uStack_28a8;
            local_28a0._8_8_ = uStack_2878;
            local_28a0._0_8_ = local_2880;
            local_28a0._16_8_ = uStack_2870;
            local_28a0._24_8_ = uStack_2868;
            local_2960._8_8_ = uStack_2938;
            local_2960._0_8_ = local_2940;
            local_2960._16_8_ = uStack_2930;
            local_2960._24_8_ = uStack_2928;
            local_2920._8_8_ = uStack_28f8;
            local_2920._0_8_ = local_2900;
            local_2920._16_8_ = uStack_28f0;
            local_2920._24_8_ = uStack_28e8;
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else {
          local_1d68 = 0;
          do {
            local_2be8 = (undefined1 (*) [32])(*local_2468 + local_1d68);
            local_2bf0 = (long)*local_1d48 + (long)local_1d68;
            local_2a60 = *(undefined8 *)*local_2be8;
            uStack_2a58 = *(undefined8 *)(*local_2be8 + 8);
            uStack_2a50 = *(undefined8 *)(*local_2be8 + 0x10);
            uStack_2a48 = *(undefined8 *)(*local_2be8 + 0x18);
            local_4a0 = (undefined1 (*) [32])(*local_2be8 + local_1d3c);
            local_2a40 = *(undefined8 *)*local_4a0;
            uStack_2a38 = *(undefined8 *)(*local_4a0 + 8);
            uStack_2a30 = *(undefined8 *)(*local_4a0 + 0x10);
            uStack_2a28 = *(undefined8 *)(*local_4a0 + 0x18);
            local_4a8 = (undefined1 (*) [32])(*local_2be8 + local_1d3c * 2);
            local_2a20 = *(undefined8 *)*local_4a8;
            uStack_2a18 = *(undefined8 *)(*local_4a8 + 8);
            uStack_2a10 = *(undefined8 *)(*local_4a8 + 0x10);
            uStack_2a08 = *(undefined8 *)(*local_4a8 + 0x18);
            local_2ae0 = vpunpcklbw_avx2(*local_2be8,*local_4a0);
            local_2aa0 = vpunpckhbw_avx2(*local_2be8,*local_4a0);
            local_2b60 = vpunpcklbw_avx2(*local_4a0,*local_4a8);
            local_2b20 = vpunpckhbw_avx2(*local_4a0,*local_4a8);
            local_1d6c = local_1d54;
            local_1560 = local_2a20;
            uStack_1558 = uStack_2a18;
            uStack_1550 = uStack_2a10;
            uStack_1548 = uStack_2a08;
            local_1540 = local_2a40;
            uStack_1538 = uStack_2a38;
            uStack_1530 = uStack_2a30;
            uStack_1528 = uStack_2a28;
            local_1520 = local_2a40;
            uStack_1518 = uStack_2a38;
            uStack_1510 = uStack_2a30;
            uStack_1508 = uStack_2a28;
            local_1500 = local_2a60;
            uStack_14f8 = uStack_2a58;
            uStack_14f0 = uStack_2a50;
            uStack_14e8 = uStack_2a48;
            local_f20 = local_2a20;
            uStack_f18 = uStack_2a18;
            uStack_f10 = uStack_2a10;
            uStack_f08 = uStack_2a08;
            local_f00 = local_2a40;
            uStack_ef8 = uStack_2a38;
            uStack_ef0 = uStack_2a30;
            uStack_ee8 = uStack_2a28;
            local_ee0 = local_2a40;
            uStack_ed8 = uStack_2a38;
            uStack_ed0 = uStack_2a30;
            uStack_ec8 = uStack_2a28;
            local_ec0 = local_2a60;
            uStack_eb8 = uStack_2a58;
            uStack_eb0 = uStack_2a50;
            uStack_ea8 = uStack_2a48;
            local_498 = local_2be8;
            do {
              local_2be8 = (undefined1 (*) [32])(*local_2be8 + (local_1d3c << 1));
              puVar124 = local_2be0;
              y_convolve_4tap_32x2_avx2();
              sr_y_round_store_32x2_avx2
                        ((__m256i *)CONCAT44(in_stack_ffffffffffffc14c,in_stack_ffffffffffffc148),
                         puVar124,0);
              local_2ae0._8_8_ = uStack_2ab8;
              local_2ae0._0_8_ = local_2ac0;
              local_2ae0._16_8_ = uStack_2ab0;
              local_2ae0._24_8_ = uStack_2aa8;
              local_2aa0._8_8_ = uStack_2a78;
              local_2aa0._0_8_ = local_2a80;
              local_2aa0._16_8_ = uStack_2a70;
              local_2aa0._24_8_ = uStack_2a68;
              local_2b60._8_8_ = uStack_2b38;
              local_2b60._0_8_ = local_2b40;
              local_2b60._16_8_ = uStack_2b30;
              local_2b60._24_8_ = uStack_2b28;
              local_2b20._8_8_ = uStack_2af8;
              local_2b20._0_8_ = local_2b00;
              local_2b20._16_8_ = uStack_2af0;
              local_2b20._24_8_ = uStack_2ae8;
              local_2bf0 = local_2bf0 + (local_1d4c << 1);
              local_1d6c = local_1d6c + -2;
            } while (local_1d6c != 0);
            local_1d68 = local_1d68 + 0x20;
          } while (local_1d68 < local_1d50);
        }
      }
    }
    else if (local_1e44 == 6) {
      local_2bf8 = (undefined1 (*) [16])((long)local_1d38 - (long)(local_1d3c << 1));
      if (local_1d50 < 5) {
        prepare_half_coeffs_6tap_ssse3
                  ((InterpFilterParams *)CONCAT44(in_ECX,in_R8D),in_R9D,
                   (__m128i *)in_stack_ffffffffffffc160);
        local_1d6c = local_1d54;
        if (local_1d50 == 2) {
          iVar106 = loadu_int16(local_2bf8);
          local_1ad4 = (uint)iVar106;
          local_1af0._4_4_ = 0;
          local_1af0._0_4_ = local_1ad4;
          local_2c60 = local_1af0._0_8_;
          uStack_2c58 = 0;
          local_1af0 = ZEXT416(local_1ad4);
          iVar106 = loadu_int16(*local_2bf8 + local_1d3c);
          local_1af4 = (uint)iVar106;
          local_1b10._4_4_ = 0;
          local_1b10._0_4_ = local_1af4;
          local_2c50 = local_1b10._0_8_;
          uStack_2c48 = 0;
          local_1b10 = ZEXT416(local_1af4);
          iVar106 = loadu_int16(*local_2bf8 + local_1d3c * 2);
          local_1b14 = (uint)iVar106;
          local_1b30._4_4_ = 0;
          local_1b30._0_4_ = local_1b14;
          local_2c40 = local_1b30._0_8_;
          uStack_2c38 = 0;
          local_1b30 = ZEXT416(local_1b14);
          iVar106 = loadu_int16(*local_2bf8 + local_1d3c * 3);
          local_1b34 = (uint)iVar106;
          local_1b50._4_4_ = 0;
          local_1b50._0_4_ = local_1b34;
          local_2c30 = local_1b50._0_8_;
          uStack_2c28 = 0;
          local_1b50 = ZEXT416(local_1b34);
          iVar106 = loadu_int16(*local_2bf8 + (local_1d3c << 2));
          local_1b54 = (uint)iVar106;
          local_1b70._4_4_ = 0;
          local_1b70._0_4_ = local_1b54;
          local_2c20 = local_1b70._0_8_;
          uStack_2c18 = 0;
          local_280 = local_2c60;
          uStack_278 = uStack_2c58;
          local_290 = local_2c50;
          uStack_288 = uStack_2c48;
          auVar71._8_8_ = uStack_2c58;
          auVar71._0_8_ = local_2c60;
          auVar70._8_8_ = uStack_2c48;
          auVar70._0_8_ = local_2c50;
          auVar117 = vpunpcklwd_avx(auVar71,auVar70);
          local_2a0 = local_2c50;
          uStack_298 = uStack_2c48;
          local_2b0 = local_2c40;
          uStack_2a8 = uStack_2c38;
          auVar69._8_8_ = uStack_2c48;
          auVar69._0_8_ = local_2c50;
          auVar68._8_8_ = uStack_2c38;
          auVar68._0_8_ = local_2c40;
          auVar1 = vpunpcklwd_avx(auVar69,auVar68);
          local_2c0 = local_2c40;
          uStack_2b8 = uStack_2c38;
          local_2d0 = local_2c30;
          uStack_2c8 = uStack_2c28;
          auVar67._8_8_ = uStack_2c38;
          auVar67._0_8_ = local_2c40;
          auVar66._8_8_ = uStack_2c28;
          auVar66._0_8_ = local_2c30;
          auVar2 = vpunpcklwd_avx(auVar67,auVar66);
          local_2e0 = local_2c30;
          uStack_2d8 = uStack_2c28;
          local_2f0 = local_1b70._0_8_;
          uStack_2e8 = 0;
          auVar65._8_8_ = uStack_2c28;
          auVar65._0_8_ = local_2c30;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = local_1b70._0_8_;
          auVar3 = vpunpcklwd_avx(auVar65,auVar64);
          local_2ca0 = auVar117._0_8_;
          uStack_2c98 = auVar117._8_8_;
          local_2cb0 = auVar1._0_8_;
          uStack_2ca8 = auVar1._8_8_;
          local_680 = local_2ca0;
          uStack_678 = uStack_2c98;
          local_690 = local_2cb0;
          uStack_688 = uStack_2ca8;
          vpunpcklbw_avx(auVar117,auVar1);
          local_2cc0 = auVar2._0_8_;
          uStack_2cb8 = auVar2._8_8_;
          local_2cd0 = auVar3._0_8_;
          uStack_2cc8 = auVar3._8_8_;
          local_6a0 = local_2cc0;
          uStack_698 = uStack_2cb8;
          local_6b0 = local_2cd0;
          uStack_6a8 = uStack_2cc8;
          vpunpcklbw_avx(auVar2,auVar3);
          local_1b70 = ZEXT416(local_1b54);
          do {
            pauVar114 = (undefined1 (*) [16])(*local_2bf8 + (local_1d3c << 1));
            lVar111 = (long)local_1d3c;
            puVar109 = &local_2c60;
            local_2bf8 = pauVar114;
            y_convolve_6tap_2x2_ssse3
                      ((uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffc180),(ptrdiff_t)in_RDX,
                       (__m128i *)CONCAT44(in_ECX,in_R8D),(__m128i *)CONCAT44(in_R9D,iVar107),
                       (__m128i *)in_stack_ffffffffffffc160);
            src_06[1] = lVar111;
            src_06[0] = (longlong)pauVar114;
            alVar123 = sr_y_round_sse2(src_06);
            res_19[1] = (long)local_1d4c;
            res_19[0] = (longlong)local_1d48;
            pack_store_2x2_sse2(res_19,alVar123[1],(ptrdiff_t)puVar109);
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else {
          local_1a34 = loadu_int32(local_2bf8);
          local_1a50._4_4_ = 0;
          local_1a50._0_4_ = local_1a34;
          uVar103 = local_1a50._0_8_;
          local_1a50 = ZEXT416(local_1a34);
          local_1a54 = loadu_int32(*local_2bf8 + local_1d3c);
          local_1a70._4_4_ = 0;
          local_1a70._0_4_ = local_1a54;
          uVar102 = local_1a70._0_8_;
          local_1a70 = ZEXT416(local_1a54);
          local_1a74 = loadu_int32(*local_2bf8 + local_1d3c * 2);
          local_1a90._4_4_ = 0;
          local_1a90._0_4_ = local_1a74;
          uVar122 = local_1a90._0_8_;
          local_1a90 = ZEXT416(local_1a74);
          local_1a94 = loadu_int32(*local_2bf8 + local_1d3c * 3);
          local_1ab0._4_4_ = 0;
          local_1ab0._0_4_ = local_1a94;
          uVar119 = local_1ab0._0_8_;
          local_1ab0 = ZEXT416(local_1a94);
          local_1ab4 = loadu_int32(*local_2bf8 + (local_1d3c << 2));
          local_1ad0._4_4_ = 0;
          local_1ad0._0_4_ = local_1ab4;
          local_100 = uVar103;
          uStack_f8 = 0;
          local_110 = uVar102;
          uStack_108 = 0;
          auVar95._8_8_ = 0;
          auVar95._0_8_ = uVar103;
          auVar94._8_8_ = 0;
          auVar94._0_8_ = uVar102;
          auVar117 = vpunpckldq_avx(auVar95,auVar94);
          local_120 = uVar102;
          uStack_118 = 0;
          local_130 = uVar122;
          uStack_128 = 0;
          auVar93._8_8_ = 0;
          auVar93._0_8_ = uVar102;
          auVar92._8_8_ = 0;
          auVar92._0_8_ = uVar122;
          auVar1 = vpunpckldq_avx(auVar93,auVar92);
          local_140 = uVar122;
          uStack_138 = 0;
          local_150 = uVar119;
          uStack_148 = 0;
          auVar91._8_8_ = 0;
          auVar91._0_8_ = uVar122;
          auVar90._8_8_ = 0;
          auVar90._0_8_ = uVar119;
          auVar2 = vpunpckldq_avx(auVar91,auVar90);
          local_160 = uVar119;
          uStack_158 = 0;
          local_170 = local_1ad0._0_8_;
          uStack_168 = 0;
          auVar89._8_8_ = 0;
          auVar89._0_8_ = uVar119;
          auVar88._8_8_ = 0;
          auVar88._0_8_ = local_1ad0._0_8_;
          auVar3 = vpunpckldq_avx(auVar89,auVar88);
          local_2d90 = auVar117._0_8_;
          uStack_2d88 = auVar117._8_8_;
          local_2da0 = auVar1._0_8_;
          uStack_2d98 = auVar1._8_8_;
          local_640 = local_2d90;
          uStack_638 = uStack_2d88;
          local_650 = local_2da0;
          uStack_648 = uStack_2d98;
          vpunpcklbw_avx(auVar117,auVar1);
          local_2db0 = auVar2._0_8_;
          uStack_2da8 = auVar2._8_8_;
          local_2dc0 = auVar3._0_8_;
          uStack_2db8 = auVar3._8_8_;
          local_660 = local_2db0;
          uStack_658 = uStack_2da8;
          local_670 = local_2dc0;
          uStack_668 = uStack_2db8;
          vpunpcklbw_avx(auVar2,auVar3);
          local_1ad0 = ZEXT416(local_1ab4);
          do {
            pauVar114 = (undefined1 (*) [16])(*local_2bf8 + (local_1d3c << 1));
            lVar111 = (long)local_1d3c;
            local_2bf8 = pauVar114;
            y_convolve_6tap_4x2_ssse3
                      ((uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffc180),(ptrdiff_t)in_RDX,
                       (__m128i *)CONCAT44(in_ECX,in_R8D),(__m128i *)CONCAT44(in_R9D,iVar107),
                       (__m128i *)in_stack_ffffffffffffc160);
            src_07[1] = lVar111;
            src_07[0] = (longlong)pauVar114;
            sr_y_round_sse2(src_07);
            res_13[1] = (longlong)in_stack_ffffffffffffc160;
            res_13[0] = in_stack_ffffffffffffc158;
            pack_store_4x2_sse2(res_13,(uint8_t *)
                                       CONCAT44(in_stack_ffffffffffffc154,in_stack_ffffffffffffc150)
                                ,CONCAT44(in_stack_ffffffffffffc14c,in_stack_ffffffffffffc148));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
      }
      else {
        prepare_half_coeffs_6tap_avx2
                  ((InterpFilterParams *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffc160);
        if (local_1d50 == 8) {
          local_838 = local_2bf8;
          local_1770 = *(ulong *)*local_2bf8;
          uStack_848 = 0;
          local_858 = (ulong *)(*local_2bf8 + local_1d3c);
          local_1780 = *local_858;
          uStack_868 = 0;
          local_878 = (ulong *)(*local_2bf8 + local_1d3c * 2);
          local_1790 = *local_878;
          uStack_888 = 0;
          local_898 = (ulong *)(*local_2bf8 + local_1d3c * 3);
          local_17a0 = *local_898;
          uStack_8a8 = 0;
          local_8b8 = (undefined8 *)(*local_2bf8 + (local_1d3c << 2));
          uStack_14d0 = *local_8b8;
          uStack_8c8 = 0;
          uStack_1768 = 0;
          uStack_1778 = 0;
          uStack_1788 = 0;
          uStack_1798 = 0;
          uStack_1478 = 0;
          uStack_1468 = 0;
          uStack_1498 = 0;
          uStack_1488 = 0;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_1770;
          auVar13._16_8_ = local_1780;
          auVar13._24_8_ = 0;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_1780;
          auVar12._16_8_ = local_1790;
          auVar12._24_8_ = 0;
          vpunpcklbw_avx2(auVar13,auVar12);
          uStack_14b8 = 0;
          uStack_14a8 = 0;
          uStack_14d8 = 0;
          uStack_14c8 = 0;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_1790;
          auVar11._16_8_ = local_17a0;
          auVar11._24_8_ = 0;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_17a0;
          auVar10._16_8_ = uStack_14d0;
          auVar10._24_8_ = 0;
          vpunpcklbw_avx2(auVar11,auVar10);
          local_1d6c = local_1d54;
          local_14e0 = local_17a0;
          local_14c0 = local_1790;
          uStack_14b0 = local_17a0;
          local_14a0 = local_1780;
          uStack_1490 = local_1790;
          local_1480 = local_1770;
          uStack_1470 = local_1780;
          local_8d0 = uStack_14d0;
          local_8b0 = local_17a0;
          local_890 = local_1790;
          local_870 = local_1780;
          local_850 = local_1770;
          do {
            local_2bf8 = (undefined1 (*) [16])(*local_2bf8 + (local_1d3c << 1));
            y_convolve_6tap_8x2_avx2
                      ((uint8_t *)in_stack_ffffffffffffc1b0,
                       CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       in_stack_ffffffffffffc1a0,in_stack_ffffffffffffc198,in_stack_ffffffffffffc190
                      );
            res_15[1]._0_4_ = in_stack_ffffffffffffc180;
            res_15[0] = (longlong)in_RDX;
            res_15[1]._4_4_ = in_ESI;
            res_15[2] = (longlong)in_RDI;
            res_15[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_round_store_8x2_avx2
                      (res_15,(uint8_t *)CONCAT44(in_ECX,in_R8D),CONCAT44(in_R9D,iVar107));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else if (local_1d50 == 0x10) {
          local_1820 = local_2bf8;
          local_30c0 = *(undefined8 *)*local_2bf8;
          uStack_30b8 = *(undefined8 *)(*local_2bf8 + 8);
          local_1828 = (undefined1 (*) [16])(*local_2bf8 + local_1d3c);
          local_30e0 = *(undefined8 *)*local_1828;
          uStack_30d8 = *(undefined8 *)(*local_1828 + 8);
          local_1830 = (undefined1 (*) [16])(*local_2bf8 + local_1d3c * 2);
          local_3100 = *(undefined8 *)*local_1830;
          uStack_30f8 = *(undefined8 *)(*local_1830 + 8);
          local_1838 = (undefined1 (*) [16])(*local_2bf8 + local_1d3c * 3);
          local_3120 = *(undefined8 *)*local_1838;
          uStack_3118 = *(undefined8 *)(*local_1838 + 8);
          local_1840 = (undefined8 *)(*local_2bf8 + (local_1d3c << 2));
          uStack_3110 = *local_1840;
          uStack_3108 = local_1840[1];
          auVar17._16_8_ = local_30e0;
          auVar17._0_16_ = *local_2bf8;
          auVar17._24_8_ = uStack_30d8;
          auVar16._16_8_ = local_3100;
          auVar16._0_16_ = *local_1828;
          auVar16._24_8_ = uStack_30f8;
          local_3060 = vpunpcklbw_avx2(auVar17,auVar16);
          auVar15._16_8_ = local_3120;
          auVar15._0_16_ = *local_1830;
          auVar15._24_8_ = uStack_3118;
          auVar14._16_8_ = uStack_3110;
          auVar14._0_16_ = *local_1838;
          auVar14._24_8_ = uStack_3108;
          local_3040 = vpunpcklbw_avx2(auVar15,auVar14);
          auVar34._16_8_ = local_30e0;
          auVar34._0_16_ = *local_2bf8;
          auVar34._24_8_ = uStack_30d8;
          auVar33._16_8_ = local_3100;
          auVar33._0_16_ = *local_1828;
          auVar33._24_8_ = uStack_30f8;
          local_3000 = vpunpckhbw_avx2(auVar34,auVar33);
          auVar32._16_8_ = local_3120;
          auVar32._0_16_ = *local_1830;
          auVar32._24_8_ = uStack_3118;
          auVar31._16_8_ = uStack_3110;
          auVar31._0_16_ = *local_1838;
          auVar31._24_8_ = uStack_3108;
          auVar125 = vpunpckhbw_avx2(auVar32,auVar31);
          local_1d6c = local_1d54;
          uStack_30f0 = local_3120;
          uStack_30e8 = uStack_3118;
          uStack_30d0 = local_3100;
          uStack_30c8 = uStack_30f8;
          uStack_30b0 = local_30e0;
          uStack_30a8 = uStack_30d8;
          local_1760 = local_3120;
          uStack_1758 = uStack_3118;
          local_1750 = local_3100;
          uStack_1748 = uStack_30f8;
          local_1740 = local_30e0;
          uStack_1738 = uStack_30d8;
          local_1730 = local_30c0;
          uStack_1728 = uStack_30b8;
          local_1460 = local_3120;
          uStack_1458 = uStack_3118;
          uStack_1450 = uStack_3110;
          uStack_1448 = uStack_3108;
          local_1440 = local_3100;
          uStack_1438 = uStack_30f8;
          uStack_1430 = local_3120;
          uStack_1428 = uStack_3118;
          local_1420 = local_30e0;
          uStack_1418 = uStack_30d8;
          uStack_1410 = local_3100;
          uStack_1408 = uStack_30f8;
          local_1400 = local_30c0;
          uStack_13f8 = uStack_30b8;
          uStack_13f0 = local_30e0;
          uStack_13e8 = uStack_30d8;
          local_ea0 = local_3120;
          uStack_e98 = uStack_3118;
          uStack_e90 = uStack_3110;
          uStack_e88 = uStack_3108;
          local_e80 = local_3100;
          uStack_e78 = uStack_30f8;
          uStack_e70 = local_3120;
          uStack_e68 = uStack_3118;
          local_e60 = local_30e0;
          uStack_e58 = uStack_30d8;
          uStack_e50 = local_3100;
          uStack_e48 = uStack_30f8;
          local_e40 = local_30c0;
          uStack_e38 = uStack_30b8;
          uStack_e30 = local_30e0;
          uStack_e28 = uStack_30d8;
          do {
            local_2bf8 = (undefined1 (*) [16])(*local_2bf8 + (local_1d3c << 1));
            y_convolve_6tap_16x2_avx2
                      ((uint8_t *)in_stack_ffffffffffffc1a0,(ptrdiff_t)in_stack_ffffffffffffc198,
                       in_stack_ffffffffffffc190,in_RDI,
                       (__m256i *)CONCAT44(in_ESI,in_stack_ffffffffffffc180),in_RDX);
            sr_y_round_store_16x2_avx2
                      (in_stack_ffffffffffffc1a0,(uint8_t *)in_stack_ffffffffffffc198,
                       (ptrdiff_t)in_stack_ffffffffffffc190);
            local_3000 = auVar125;
            local_3060 = local_3040;
            local_3040._8_8_ = uStack_3018;
            local_3040._0_8_ = local_3020;
            local_3040._16_8_ = uStack_3010;
            local_3040._24_8_ = uStack_3008;
            auVar125._8_8_ = uStack_2fb8;
            auVar125._0_8_ = in_stack_ffffffffffffd040;
            auVar125._16_8_ = uStack_2fb0;
            auVar125._24_8_ = uStack_2fa8;
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else {
          local_1d68 = 0;
          do {
            local_33e8 = (undefined1 (*) [32])(*local_2bf8 + local_1d68);
            local_33f0 = (long)*local_1d48 + (long)local_1d68;
            local_31e0 = *(undefined8 *)*local_33e8;
            uStack_31d8 = *(undefined8 *)(*local_33e8 + 8);
            uStack_31d0 = *(undefined8 *)(*local_33e8 + 0x10);
            uStack_31c8 = *(undefined8 *)(*local_33e8 + 0x18);
            local_478 = (undefined1 (*) [32])(*local_33e8 + local_1d3c);
            local_31c0 = *(undefined8 *)*local_478;
            uStack_31b8 = *(undefined8 *)(*local_478 + 8);
            uStack_31b0 = *(undefined8 *)(*local_478 + 0x10);
            uStack_31a8 = *(undefined8 *)(*local_478 + 0x18);
            local_480 = (undefined1 (*) [32])(*local_33e8 + local_1d3c * 2);
            local_31a0 = *(undefined8 *)*local_480;
            uStack_3198 = *(undefined8 *)(*local_480 + 8);
            uStack_3190 = *(undefined8 *)(*local_480 + 0x10);
            uStack_3188 = *(undefined8 *)(*local_480 + 0x18);
            local_488 = (undefined1 (*) [32])(*local_33e8 + local_1d3c * 3);
            local_3180 = *(undefined8 *)*local_488;
            uStack_3178 = *(undefined8 *)(*local_488 + 8);
            uStack_3170 = *(undefined8 *)(*local_488 + 0x10);
            uStack_3168 = *(undefined8 *)(*local_488 + 0x18);
            local_490 = (undefined1 (*) [32])(*local_33e8 + (local_1d3c << 2));
            local_3160 = *(undefined8 *)*local_490;
            uStack_3158 = *(undefined8 *)(*local_490 + 8);
            uStack_3150 = *(undefined8 *)(*local_490 + 0x10);
            uStack_3148 = *(undefined8 *)(*local_490 + 0x18);
            local_32a0 = vpunpcklbw_avx2(*local_33e8,*local_478);
            local_3280 = vpunpcklbw_avx2(*local_480,*local_488);
            local_3240 = vpunpckhbw_avx2(*local_33e8,*local_478);
            local_3220 = vpunpckhbw_avx2(*local_480,*local_488);
            local_3360 = vpunpcklbw_avx2(*local_478,*local_480);
            local_3340 = vpunpcklbw_avx2(*local_488,*local_490);
            local_3300 = vpunpckhbw_avx2(*local_478,*local_480);
            local_32e0 = vpunpckhbw_avx2(*local_488,*local_490);
            local_1d6c = local_1d54;
            local_13e0 = local_3160;
            uStack_13d8 = uStack_3158;
            uStack_13d0 = uStack_3150;
            uStack_13c8 = uStack_3148;
            local_13c0 = local_3180;
            uStack_13b8 = uStack_3178;
            uStack_13b0 = uStack_3170;
            uStack_13a8 = uStack_3168;
            local_13a0 = local_31a0;
            uStack_1398 = uStack_3198;
            uStack_1390 = uStack_3190;
            uStack_1388 = uStack_3188;
            local_1380 = local_31c0;
            uStack_1378 = uStack_31b8;
            uStack_1370 = uStack_31b0;
            uStack_1368 = uStack_31a8;
            local_1360 = local_3180;
            uStack_1358 = uStack_3178;
            uStack_1350 = uStack_3170;
            uStack_1348 = uStack_3168;
            local_1340 = local_31a0;
            uStack_1338 = uStack_3198;
            uStack_1330 = uStack_3190;
            uStack_1328 = uStack_3188;
            local_1320 = local_31c0;
            uStack_1318 = uStack_31b8;
            uStack_1310 = uStack_31b0;
            uStack_1308 = uStack_31a8;
            local_1300 = local_31e0;
            uStack_12f8 = uStack_31d8;
            uStack_12f0 = uStack_31d0;
            uStack_12e8 = uStack_31c8;
            local_e20 = local_3160;
            uStack_e18 = uStack_3158;
            uStack_e10 = uStack_3150;
            uStack_e08 = uStack_3148;
            local_e00 = local_3180;
            uStack_df8 = uStack_3178;
            uStack_df0 = uStack_3170;
            uStack_de8 = uStack_3168;
            local_de0 = local_31a0;
            uStack_dd8 = uStack_3198;
            uStack_dd0 = uStack_3190;
            uStack_dc8 = uStack_3188;
            local_dc0 = local_31c0;
            uStack_db8 = uStack_31b8;
            uStack_db0 = uStack_31b0;
            uStack_da8 = uStack_31a8;
            local_da0 = local_3180;
            uStack_d98 = uStack_3178;
            uStack_d90 = uStack_3170;
            uStack_d88 = uStack_3168;
            local_d80 = local_31a0;
            uStack_d78 = uStack_3198;
            uStack_d70 = uStack_3190;
            uStack_d68 = uStack_3188;
            local_d60 = local_31c0;
            uStack_d58 = uStack_31b8;
            uStack_d50 = uStack_31b0;
            uStack_d48 = uStack_31a8;
            local_d40 = local_31e0;
            uStack_d38 = uStack_31d8;
            uStack_d30 = uStack_31d0;
            uStack_d28 = uStack_31c8;
            local_470 = local_33e8;
            do {
              local_33e8 = (undefined1 (*) [32])(*local_33e8 + (local_1d3c << 1));
              puVar124 = local_33e0;
              y_convolve_6tap_32x2_avx2();
              sr_y_round_store_32x2_avx2
                        ((__m256i *)CONCAT44(in_stack_ffffffffffffc14c,in_stack_ffffffffffffc148),
                         puVar124,0);
              local_32a0 = local_3280;
              local_3280._8_8_ = uStack_3258;
              local_3280._0_8_ = local_3260;
              local_3280._16_8_ = uStack_3250;
              local_3280._24_8_ = uStack_3248;
              local_3240 = local_3220;
              local_3220._8_8_ = uStack_31f8;
              local_3220._0_8_ = local_3200;
              local_3220._16_8_ = uStack_31f0;
              local_3220._24_8_ = uStack_31e8;
              local_3360 = local_3340;
              local_3340._8_8_ = uStack_3318;
              local_3340._0_8_ = local_3320;
              local_3340._16_8_ = uStack_3310;
              local_3340._24_8_ = uStack_3308;
              local_3300 = local_32e0;
              local_32e0._8_8_ = uStack_32b8;
              local_32e0._0_8_ = local_32c0;
              local_32e0._16_8_ = uStack_32b0;
              local_32e0._24_8_ = uStack_32a8;
              local_33f0 = local_33f0 + (local_1d4c << 1);
              local_1d6c = local_1d6c + -2;
            } while (local_1d6c != 0);
            local_1d68 = local_1d68 + 0x20;
          } while (local_1d68 < local_1d50);
        }
      }
    }
    else if (local_1e44 == 8) {
      local_33f8 = (undefined1 (*) [16])((long)local_1d38 - (long)(local_1d3c * 3));
      if (local_1d50 < 5) {
        prepare_half_coeffs_8tap_ssse3
                  ((InterpFilterParams *)CONCAT44(in_ECX,in_R8D),in_R9D,
                   (__m128i *)in_stack_ffffffffffffc160);
        local_1d6c = local_1d54;
        if (local_1d50 == 2) {
          iVar106 = loadu_int16(local_33f8);
          local_1954 = (uint)iVar106;
          local_1970._4_4_ = 0;
          local_1970._0_4_ = local_1954;
          local_3480 = local_1970._0_8_;
          uStack_3478 = 0;
          local_1970 = ZEXT416(local_1954);
          iVar106 = loadu_int16(*local_33f8 + local_1d3c);
          local_1974 = (uint)iVar106;
          local_1990._4_4_ = 0;
          local_1990._0_4_ = local_1974;
          local_3470 = local_1990._0_8_;
          uStack_3468 = 0;
          local_1990 = ZEXT416(local_1974);
          iVar106 = loadu_int16(*local_33f8 + local_1d3c * 2);
          local_1994 = (uint)iVar106;
          local_19b0._4_4_ = 0;
          local_19b0._0_4_ = local_1994;
          local_3460 = local_19b0._0_8_;
          uStack_3458 = 0;
          local_19b0 = ZEXT416(local_1994);
          iVar106 = loadu_int16(*local_33f8 + local_1d3c * 3);
          local_19b4 = (uint)iVar106;
          local_19d0._4_4_ = 0;
          local_19d0._0_4_ = local_19b4;
          local_3450 = local_19d0._0_8_;
          uStack_3448 = 0;
          local_19d0 = ZEXT416(local_19b4);
          iVar106 = loadu_int16(*local_33f8 + (local_1d3c << 2));
          local_19d4 = (uint)iVar106;
          local_19f0._4_4_ = 0;
          local_19f0._0_4_ = local_19d4;
          local_3440 = local_19f0._0_8_;
          uStack_3438 = 0;
          local_19f0 = ZEXT416(local_19d4);
          iVar106 = loadu_int16(*local_33f8 + local_1d3c * 5);
          local_19f4 = (uint)iVar106;
          local_1a10._4_4_ = 0;
          local_1a10._0_4_ = local_19f4;
          local_3430 = local_1a10._0_8_;
          uStack_3428 = 0;
          local_1a10 = ZEXT416(local_19f4);
          iVar106 = loadu_int16(*local_33f8 + local_1d3c * 6);
          local_1a14 = (uint)iVar106;
          local_1a30._4_4_ = 0;
          local_1a30._0_4_ = local_1a14;
          local_3420 = local_1a30._0_8_;
          uStack_3418 = 0;
          local_1c0 = local_3480;
          uStack_1b8 = uStack_3478;
          local_1d0 = local_3470;
          uStack_1c8 = uStack_3468;
          auVar83._8_8_ = uStack_3478;
          auVar83._0_8_ = local_3480;
          auVar82._8_8_ = uStack_3468;
          auVar82._0_8_ = local_3470;
          auVar117 = vpunpcklwd_avx(auVar83,auVar82);
          local_1e0 = local_3470;
          uStack_1d8 = uStack_3468;
          local_1f0 = local_3460;
          uStack_1e8 = uStack_3458;
          auVar81._8_8_ = uStack_3468;
          auVar81._0_8_ = local_3470;
          auVar80._8_8_ = uStack_3458;
          auVar80._0_8_ = local_3460;
          auVar1 = vpunpcklwd_avx(auVar81,auVar80);
          local_200 = local_3460;
          uStack_1f8 = uStack_3458;
          local_210 = local_3450;
          uStack_208 = uStack_3448;
          auVar79._8_8_ = uStack_3458;
          auVar79._0_8_ = local_3460;
          auVar78._8_8_ = uStack_3448;
          auVar78._0_8_ = local_3450;
          auVar2 = vpunpcklwd_avx(auVar79,auVar78);
          local_220 = local_3450;
          uStack_218 = uStack_3448;
          local_230 = local_3440;
          uStack_228 = uStack_3438;
          auVar77._8_8_ = uStack_3448;
          auVar77._0_8_ = local_3450;
          auVar76._8_8_ = uStack_3438;
          auVar76._0_8_ = local_3440;
          auVar3 = vpunpcklwd_avx(auVar77,auVar76);
          local_240 = local_3440;
          uStack_238 = uStack_3438;
          local_250 = local_3430;
          uStack_248 = uStack_3428;
          auVar75._8_8_ = uStack_3438;
          auVar75._0_8_ = local_3440;
          auVar74._8_8_ = uStack_3428;
          auVar74._0_8_ = local_3430;
          auVar4 = vpunpcklwd_avx(auVar75,auVar74);
          local_260 = local_3430;
          uStack_258 = uStack_3428;
          local_270 = local_1a30._0_8_;
          uStack_268 = 0;
          auVar73._8_8_ = uStack_3428;
          auVar73._0_8_ = local_3430;
          auVar72._8_8_ = 0;
          auVar72._0_8_ = local_1a30._0_8_;
          auVar5 = vpunpcklwd_avx(auVar73,auVar72);
          local_34d0 = auVar117._0_8_;
          uStack_34c8 = auVar117._8_8_;
          local_34e0 = auVar1._0_8_;
          uStack_34d8 = auVar1._8_8_;
          local_5e0 = local_34d0;
          uStack_5d8 = uStack_34c8;
          local_5f0 = local_34e0;
          uStack_5e8 = uStack_34d8;
          vpunpcklbw_avx(auVar117,auVar1);
          local_34f0 = auVar2._0_8_;
          uStack_34e8 = auVar2._8_8_;
          local_3500 = auVar3._0_8_;
          uStack_34f8 = auVar3._8_8_;
          local_600 = local_34f0;
          uStack_5f8 = uStack_34e8;
          local_610 = local_3500;
          uStack_608 = uStack_34f8;
          vpunpcklbw_avx(auVar2,auVar3);
          local_3510 = auVar4._0_8_;
          uStack_3508 = auVar4._8_8_;
          local_3520 = auVar5._0_8_;
          uStack_3518 = auVar5._8_8_;
          local_620 = local_3510;
          uStack_618 = uStack_3508;
          local_630 = local_3520;
          uStack_628 = uStack_3518;
          vpunpcklbw_avx(auVar4,auVar5);
          local_1a30 = ZEXT416(local_1a14);
          do {
            lVar111 = (long)local_1d3c;
            puVar109 = &local_3480;
            pauVar114 = local_33f8;
            y_convolve_8tap_2x2_ssse3
                      ((uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffc180),(ptrdiff_t)in_RDX,
                       (__m128i *)CONCAT44(in_ECX,in_R8D),(__m128i *)CONCAT44(in_R9D,iVar107),
                       (__m128i *)in_stack_ffffffffffffc160);
            src_08[1] = lVar111;
            src_08[0] = (longlong)pauVar114;
            alVar123 = sr_y_round_sse2(src_08);
            res_20[1] = (long)local_1d4c;
            res_20[0] = (longlong)local_1d48;
            pack_store_2x2_sse2(res_20,alVar123[1],(ptrdiff_t)puVar109);
            local_33f8 = (undefined1 (*) [16])(*local_33f8 + (local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else {
          local_187c = loadu_int32(local_33f8);
          local_1890._4_4_ = 0;
          local_1890._0_4_ = local_187c;
          uVar105 = local_1890._0_8_;
          local_1890 = ZEXT416(local_187c);
          local_1894 = loadu_int32(*local_33f8 + local_1d3c);
          local_18b0._4_4_ = 0;
          local_18b0._0_4_ = local_1894;
          uVar104 = local_18b0._0_8_;
          local_18b0 = ZEXT416(local_1894);
          local_18b4 = loadu_int32(*local_33f8 + local_1d3c * 2);
          local_18d0._4_4_ = 0;
          local_18d0._0_4_ = local_18b4;
          uVar103 = local_18d0._0_8_;
          local_18d0 = ZEXT416(local_18b4);
          local_18d4 = loadu_int32(*local_33f8 + local_1d3c * 3);
          local_18f0._4_4_ = 0;
          local_18f0._0_4_ = local_18d4;
          uVar102 = local_18f0._0_8_;
          local_18f0 = ZEXT416(local_18d4);
          local_18f4 = loadu_int32(*local_33f8 + (local_1d3c << 2));
          local_1910._4_4_ = 0;
          local_1910._0_4_ = local_18f4;
          uVar122 = local_1910._0_8_;
          local_1910 = ZEXT416(local_18f4);
          local_1914 = loadu_int32(*local_33f8 + local_1d3c * 5);
          local_1930._4_4_ = 0;
          local_1930._0_4_ = local_1914;
          uVar119 = local_1930._0_8_;
          local_1930 = ZEXT416(local_1914);
          local_1934 = loadu_int32(*local_33f8 + local_1d3c * 6);
          local_1950._4_4_ = 0;
          local_1950._0_4_ = local_1934;
          local_40 = uVar105;
          uStack_38 = 0;
          local_50 = uVar104;
          uStack_48 = 0;
          auVar101._8_8_ = 0;
          auVar101._0_8_ = uVar105;
          auVar117._8_8_ = 0;
          auVar117._0_8_ = uVar104;
          auVar117 = vpunpckldq_avx(auVar101,auVar117);
          local_60 = uVar104;
          uStack_58 = 0;
          local_70 = uVar103;
          uStack_68 = 0;
          auVar100._8_8_ = 0;
          auVar100._0_8_ = uVar104;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar103;
          auVar1 = vpunpckldq_avx(auVar100,auVar1);
          local_80 = uVar103;
          uStack_78 = 0;
          local_90 = uVar102;
          uStack_88 = 0;
          auVar99._8_8_ = 0;
          auVar99._0_8_ = uVar103;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar102;
          auVar2 = vpunpckldq_avx(auVar99,auVar2);
          local_a0 = uVar102;
          uStack_98 = 0;
          local_b0 = uVar122;
          uStack_a8 = 0;
          auVar98._8_8_ = 0;
          auVar98._0_8_ = uVar102;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar122;
          auVar3 = vpunpckldq_avx(auVar98,auVar3);
          local_c0 = uVar122;
          uStack_b8 = 0;
          local_d0 = uVar119;
          uStack_c8 = 0;
          auVar97._8_8_ = 0;
          auVar97._0_8_ = uVar122;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar119;
          auVar4 = vpunpckldq_avx(auVar97,auVar4);
          local_e0 = uVar119;
          uStack_d8 = 0;
          local_f0 = local_1950._0_8_;
          uStack_e8 = 0;
          auVar96._8_8_ = 0;
          auVar96._0_8_ = uVar119;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_1950._0_8_;
          auVar5 = vpunpckldq_avx(auVar96,auVar5);
          local_3610 = auVar117._0_8_;
          uStack_3608 = auVar117._8_8_;
          local_3620 = auVar1._0_8_;
          uStack_3618 = auVar1._8_8_;
          local_580 = local_3610;
          uStack_578 = uStack_3608;
          local_590 = local_3620;
          uStack_588 = uStack_3618;
          vpunpcklbw_avx(auVar117,auVar1);
          local_3630 = auVar2._0_8_;
          uStack_3628 = auVar2._8_8_;
          local_3640 = auVar3._0_8_;
          uStack_3638 = auVar3._8_8_;
          local_5a0 = local_3630;
          uStack_598 = uStack_3628;
          local_5b0 = local_3640;
          uStack_5a8 = uStack_3638;
          vpunpcklbw_avx(auVar2,auVar3);
          local_3650 = auVar4._0_8_;
          uStack_3648 = auVar4._8_8_;
          local_3660 = auVar5._0_8_;
          uStack_3658 = auVar5._8_8_;
          local_5c0 = local_3650;
          uStack_5b8 = uStack_3648;
          local_5d0 = local_3660;
          uStack_5c8 = uStack_3658;
          vpunpcklbw_avx(auVar4,auVar5);
          local_1950 = ZEXT416(local_1934);
          do {
            lVar111 = (long)local_1d3c;
            pauVar114 = local_33f8;
            y_convolve_8tap_4x2_ssse3
                      ((uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffc180),(ptrdiff_t)in_RDX,
                       (__m128i *)CONCAT44(in_ECX,in_R8D),(__m128i *)CONCAT44(in_R9D,iVar107),
                       (__m128i *)in_stack_ffffffffffffc160);
            src_09[1] = lVar111;
            src_09[0] = (longlong)pauVar114;
            sr_y_round_sse2(src_09);
            alVar123[1] = (longlong)in_stack_ffffffffffffc160;
            alVar123[0] = in_stack_ffffffffffffc158;
            pack_store_4x2_sse2(alVar123,(uint8_t *)
                                         CONCAT44(in_stack_ffffffffffffc154,
                                                  in_stack_ffffffffffffc150),
                                CONCAT44(in_stack_ffffffffffffc14c,in_stack_ffffffffffffc148));
            local_33f8 = (undefined1 (*) [16])(*local_33f8 + (local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
      }
      else {
        prepare_half_coeffs_8tap_avx2
                  ((InterpFilterParams *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffc160);
        if (local_1d50 == 8) {
          local_758 = local_33f8;
          local_16d0 = *(ulong *)*local_33f8;
          uStack_768 = 0;
          local_778 = (ulong *)(*local_33f8 + local_1d3c);
          local_16e0 = *local_778;
          uStack_788 = 0;
          local_798 = (ulong *)(*local_33f8 + local_1d3c * 2);
          local_16f0 = *local_798;
          uStack_7a8 = 0;
          local_7b8 = (ulong *)(*local_33f8 + local_1d3c * 3);
          local_1700 = *local_7b8;
          uStack_7c8 = 0;
          local_7d8 = (ulong *)(*local_33f8 + (local_1d3c << 2));
          local_1710 = *local_7d8;
          uStack_7e8 = 0;
          local_7f8 = (ulong *)(*local_33f8 + local_1d3c * 5);
          local_1720 = *local_7f8;
          uStack_808 = 0;
          local_818 = (undefined8 *)(*local_33f8 + local_1d3c * 6);
          uStack_12d0 = *local_818;
          uStack_828 = 0;
          uStack_16c8 = 0;
          uStack_16d8 = 0;
          uStack_16e8 = 0;
          uStack_16f8 = 0;
          uStack_1708 = 0;
          uStack_1718 = 0;
          uStack_1238 = 0;
          uStack_1228 = 0;
          uStack_1258 = 0;
          uStack_1248 = 0;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = local_16d0;
          auVar23._16_8_ = local_16e0;
          auVar23._24_8_ = 0;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = local_16e0;
          auVar22._16_8_ = local_16f0;
          auVar22._24_8_ = 0;
          vpunpcklbw_avx2(auVar23,auVar22);
          uStack_1278 = 0;
          uStack_1268 = 0;
          uStack_1298 = 0;
          uStack_1288 = 0;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = local_16f0;
          auVar21._16_8_ = local_1700;
          auVar21._24_8_ = 0;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_1700;
          auVar20._16_8_ = local_1710;
          auVar20._24_8_ = 0;
          vpunpcklbw_avx2(auVar21,auVar20);
          uStack_12b8 = 0;
          uStack_12a8 = 0;
          uStack_12d8 = 0;
          uStack_12c8 = 0;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_1710;
          auVar19._16_8_ = local_1720;
          auVar19._24_8_ = 0;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_1720;
          auVar18._16_8_ = uStack_12d0;
          auVar18._24_8_ = 0;
          vpunpcklbw_avx2(auVar19,auVar18);
          local_1d6c = local_1d54;
          local_12e0 = local_1720;
          local_12c0 = local_1710;
          uStack_12b0 = local_1720;
          local_12a0 = local_1700;
          uStack_1290 = local_1710;
          local_1280 = local_16f0;
          uStack_1270 = local_1700;
          local_1260 = local_16e0;
          uStack_1250 = local_16f0;
          local_1240 = local_16d0;
          uStack_1230 = local_16e0;
          local_830 = uStack_12d0;
          local_810 = local_1720;
          local_7f0 = local_1710;
          local_7d0 = local_1700;
          local_7b0 = local_16f0;
          local_790 = local_16e0;
          local_770 = local_16d0;
          do {
            y_convolve_8tap_8x2_avx2
                      ((uint8_t *)in_stack_ffffffffffffc1b0,
                       CONCAT44(in_stack_ffffffffffffc1ac,in_stack_ffffffffffffc1a8),
                       in_stack_ffffffffffffc1a0,in_stack_ffffffffffffc198,in_stack_ffffffffffffc190
                      );
            res_16[1]._0_4_ = in_stack_ffffffffffffc180;
            res_16[0] = (longlong)in_RDX;
            res_16[1]._4_4_ = in_ESI;
            res_16[2] = (longlong)in_RDI;
            res_16[3] = (longlong)in_stack_ffffffffffffc190;
            sr_y_round_store_8x2_avx2
                      (res_16,(uint8_t *)CONCAT44(in_ECX,in_R8D),CONCAT44(in_R9D,iVar107));
            local_33f8 = (undefined1 (*) [16])(*local_33f8 + (local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else if (local_1d50 == 0x10) {
          local_17e8 = local_33f8;
          local_1670 = *(undefined8 *)*local_33f8;
          uStack_1668 = *(undefined8 *)(*local_33f8 + 8);
          local_17f0 = (undefined1 (*) [16])(*local_33f8 + local_1d3c);
          local_1680 = *(undefined8 *)*local_17f0;
          uStack_1678 = *(undefined8 *)(*local_17f0 + 8);
          local_17f8 = (undefined1 (*) [16])(*local_33f8 + local_1d3c * 2);
          local_1690 = *(undefined8 *)*local_17f8;
          uStack_1688 = *(undefined8 *)(*local_17f8 + 8);
          local_1800 = (undefined1 (*) [16])(*local_33f8 + local_1d3c * 3);
          local_16a0 = *(undefined8 *)*local_1800;
          uStack_1698 = *(undefined8 *)(*local_1800 + 8);
          local_1808 = (undefined1 (*) [16])(*local_33f8 + (local_1d3c << 2));
          local_16b0 = *(undefined8 *)*local_1808;
          uStack_16a8 = *(undefined8 *)(*local_1808 + 8);
          local_1810 = (undefined1 (*) [16])(*local_33f8 + local_1d3c * 5);
          local_16c0 = *(undefined8 *)*local_1810;
          uStack_16b8 = *(undefined8 *)(*local_1810 + 8);
          local_1818 = (undefined8 *)(*local_33f8 + local_1d3c * 6);
          uStack_1210 = *local_1818;
          uStack_1208 = local_1818[1];
          auVar28._16_8_ = local_1680;
          auVar28._0_16_ = *local_33f8;
          auVar28._24_8_ = uStack_1678;
          auVar27._16_8_ = local_1690;
          auVar27._0_16_ = *local_17f0;
          auVar27._24_8_ = uStack_1688;
          vpunpcklbw_avx2(auVar28,auVar27);
          auVar26._16_8_ = local_16a0;
          auVar26._0_16_ = *local_17f8;
          auVar26._24_8_ = uStack_1698;
          auVar25._16_8_ = local_16b0;
          auVar25._0_16_ = *local_1800;
          auVar25._24_8_ = uStack_16a8;
          vpunpcklbw_avx2(auVar26,auVar25);
          auVar24._16_8_ = local_16c0;
          auVar24._0_16_ = *local_1808;
          auVar24._24_8_ = uStack_16b8;
          auVar118._16_8_ = uStack_1210;
          auVar118._0_16_ = *local_1810;
          auVar118._24_8_ = uStack_1208;
          vpunpcklbw_avx2(auVar24,auVar118);
          auVar40._16_8_ = local_1680;
          auVar40._0_16_ = *local_33f8;
          auVar40._24_8_ = uStack_1678;
          auVar39._16_8_ = local_1690;
          auVar39._0_16_ = *local_17f0;
          auVar39._24_8_ = uStack_1688;
          vpunpckhbw_avx2(auVar40,auVar39);
          auVar38._16_8_ = local_16a0;
          auVar38._0_16_ = *local_17f8;
          auVar38._24_8_ = uStack_1698;
          auVar37._16_8_ = local_16b0;
          auVar37._0_16_ = *local_1800;
          auVar37._24_8_ = uStack_16a8;
          vpunpckhbw_avx2(auVar38,auVar37);
          auVar36._16_8_ = local_16c0;
          auVar36._0_16_ = *local_1808;
          auVar36._24_8_ = uStack_16b8;
          auVar35._16_8_ = uStack_1210;
          auVar35._0_16_ = *local_1810;
          auVar35._24_8_ = uStack_1208;
          vpunpckhbw_avx2(auVar36,auVar35);
          local_1d6c = local_1d54;
          local_1220 = local_16c0;
          uStack_1218 = uStack_16b8;
          local_1200 = local_16b0;
          uStack_11f8 = uStack_16a8;
          uStack_11f0 = local_16c0;
          uStack_11e8 = uStack_16b8;
          local_11e0 = local_16a0;
          uStack_11d8 = uStack_1698;
          uStack_11d0 = local_16b0;
          uStack_11c8 = uStack_16a8;
          local_11c0 = local_1690;
          uStack_11b8 = uStack_1688;
          uStack_11b0 = local_16a0;
          uStack_11a8 = uStack_1698;
          local_11a0 = local_1680;
          uStack_1198 = uStack_1678;
          uStack_1190 = local_1690;
          uStack_1188 = uStack_1688;
          local_1180 = local_1670;
          uStack_1178 = uStack_1668;
          uStack_1170 = local_1680;
          uStack_1168 = uStack_1678;
          local_d20 = local_16c0;
          uStack_d18 = uStack_16b8;
          uStack_d10 = uStack_1210;
          uStack_d08 = uStack_1208;
          local_d00 = local_16b0;
          uStack_cf8 = uStack_16a8;
          uStack_cf0 = local_16c0;
          uStack_ce8 = uStack_16b8;
          local_ce0 = local_16a0;
          uStack_cd8 = uStack_1698;
          uStack_cd0 = local_16b0;
          uStack_cc8 = uStack_16a8;
          local_cc0 = local_1690;
          uStack_cb8 = uStack_1688;
          uStack_cb0 = local_16a0;
          uStack_ca8 = uStack_1698;
          local_ca0 = local_1680;
          uStack_c98 = uStack_1678;
          uStack_c90 = local_1690;
          uStack_c88 = uStack_1688;
          local_c80 = local_1670;
          uStack_c78 = uStack_1668;
          uStack_c70 = local_1680;
          uStack_c68 = uStack_1678;
          do {
            y_convolve_8tap_16x2_avx2
                      ((uint8_t *)in_stack_ffffffffffffc1a0,(ptrdiff_t)in_stack_ffffffffffffc198,
                       in_stack_ffffffffffffc190,in_RDI,
                       (__m256i *)CONCAT44(in_ESI,in_stack_ffffffffffffc180),in_RDX);
            sr_y_round_store_16x2_avx2
                      (in_stack_ffffffffffffc1a0,(uint8_t *)in_stack_ffffffffffffc198,
                       (ptrdiff_t)in_stack_ffffffffffffc190);
            local_33f8 = (undefined1 (*) [16])(*local_33f8 + (local_1d3c << 1));
            local_1d48 = (__m256i *)((long)*local_1d48 + (long)(local_1d4c << 1));
            local_1d6c = local_1d6c + -2;
          } while (local_1d6c != 0);
        }
        else {
          local_1d68 = 0;
          do {
            local_438 = (undefined1 (*) [32])(*local_33f8 + local_1d68);
            local_1000 = *(undefined8 *)*local_438;
            uStack_ff8 = *(undefined8 *)(*local_438 + 8);
            uStack_ff0 = *(undefined8 *)(*local_438 + 0x10);
            uStack_fe8 = *(undefined8 *)(*local_438 + 0x18);
            local_440 = (undefined1 (*) [32])(*local_438 + local_1d3c);
            local_10c0 = *(undefined8 *)*local_440;
            uStack_10b8 = *(undefined8 *)(*local_440 + 8);
            uStack_10b0 = *(undefined8 *)(*local_440 + 0x10);
            uStack_10a8 = *(undefined8 *)(*local_440 + 0x18);
            local_448 = (undefined1 (*) [32])(*local_438 + local_1d3c * 2);
            local_10e0 = *(undefined8 *)*local_448;
            uStack_10d8 = *(undefined8 *)(*local_448 + 8);
            uStack_10d0 = *(undefined8 *)(*local_448 + 0x10);
            uStack_10c8 = *(undefined8 *)(*local_448 + 0x18);
            local_450 = (undefined1 (*) [32])(*local_438 + local_1d3c * 3);
            local_1100 = *(undefined8 *)*local_450;
            uStack_10f8 = *(undefined8 *)(*local_450 + 8);
            uStack_10f0 = *(undefined8 *)(*local_450 + 0x10);
            uStack_10e8 = *(undefined8 *)(*local_450 + 0x18);
            local_458 = (undefined1 (*) [32])(*local_438 + (local_1d3c << 2));
            local_1120 = *(undefined8 *)*local_458;
            uStack_1118 = *(undefined8 *)(*local_458 + 8);
            uStack_1110 = *(undefined8 *)(*local_458 + 0x10);
            uStack_1108 = *(undefined8 *)(*local_458 + 0x18);
            local_460 = (undefined1 (*) [32])(*local_438 + local_1d3c * 5);
            local_1140 = *(undefined8 *)*local_460;
            uStack_1138 = *(undefined8 *)(*local_460 + 8);
            uStack_1130 = *(undefined8 *)(*local_460 + 0x10);
            uStack_1128 = *(undefined8 *)(*local_460 + 0x18);
            local_468 = (undefined1 (*) [32])(*local_438 + local_1d3c * 6);
            local_1160 = *(undefined8 *)*local_468;
            uStack_1158 = *(undefined8 *)(*local_468 + 8);
            uStack_1150 = *(undefined8 *)(*local_468 + 0x10);
            uStack_1148 = *(undefined8 *)(*local_468 + 0x18);
            vpunpcklbw_avx2(*local_438,*local_440);
            vpunpcklbw_avx2(*local_448,*local_450);
            vpunpcklbw_avx2(*local_458,*local_460);
            vpunpckhbw_avx2(*local_438,*local_440);
            vpunpckhbw_avx2(*local_448,*local_450);
            vpunpckhbw_avx2(*local_458,*local_460);
            vpunpcklbw_avx2(*local_440,*local_448);
            vpunpcklbw_avx2(*local_450,*local_458);
            vpunpcklbw_avx2(*local_460,*local_468);
            vpunpckhbw_avx2(*local_440,*local_448);
            vpunpckhbw_avx2(*local_450,*local_458);
            vpunpckhbw_avx2(*local_460,*local_468);
            local_1d6c = local_1d54;
            local_10a0 = local_1140;
            uStack_1098 = uStack_1138;
            uStack_1090 = uStack_1130;
            uStack_1088 = uStack_1128;
            local_1080 = local_1120;
            uStack_1078 = uStack_1118;
            uStack_1070 = uStack_1110;
            uStack_1068 = uStack_1108;
            local_1060 = local_1100;
            uStack_1058 = uStack_10f8;
            uStack_1050 = uStack_10f0;
            uStack_1048 = uStack_10e8;
            local_1040 = local_10e0;
            uStack_1038 = uStack_10d8;
            uStack_1030 = uStack_10d0;
            uStack_1028 = uStack_10c8;
            local_1020 = local_10c0;
            uStack_1018 = uStack_10b8;
            uStack_1010 = uStack_10b0;
            uStack_1008 = uStack_10a8;
            local_c60 = local_1160;
            uStack_c58 = uStack_1158;
            uStack_c50 = uStack_1150;
            uStack_c48 = uStack_1148;
            local_c40 = local_1140;
            uStack_c38 = uStack_1138;
            uStack_c30 = uStack_1130;
            uStack_c28 = uStack_1128;
            local_c20 = local_1120;
            uStack_c18 = uStack_1118;
            uStack_c10 = uStack_1110;
            uStack_c08 = uStack_1108;
            local_c00 = local_1100;
            uStack_bf8 = uStack_10f8;
            uStack_bf0 = uStack_10f0;
            uStack_be8 = uStack_10e8;
            local_be0 = local_10e0;
            uStack_bd8 = uStack_10d8;
            uStack_bd0 = uStack_10d0;
            uStack_bc8 = uStack_10c8;
            local_bc0 = local_10c0;
            uStack_bb8 = uStack_10b8;
            uStack_bb0 = uStack_10b0;
            uStack_ba8 = uStack_10a8;
            local_ba0 = local_1140;
            uStack_b98 = uStack_1138;
            uStack_b90 = uStack_1130;
            uStack_b88 = uStack_1128;
            local_b80 = local_1120;
            uStack_b78 = uStack_1118;
            uStack_b70 = uStack_1110;
            uStack_b68 = uStack_1108;
            local_b60 = local_1100;
            uStack_b58 = uStack_10f8;
            uStack_b50 = uStack_10f0;
            uStack_b48 = uStack_10e8;
            local_b40 = local_10e0;
            uStack_b38 = uStack_10d8;
            uStack_b30 = uStack_10d0;
            uStack_b28 = uStack_10c8;
            local_b20 = local_10c0;
            uStack_b18 = uStack_10b8;
            uStack_b10 = uStack_10b0;
            uStack_b08 = uStack_10a8;
            local_b00 = local_1000;
            uStack_af8 = uStack_ff8;
            uStack_af0 = uStack_ff0;
            uStack_ae8 = uStack_fe8;
            do {
              puVar124 = &stack0xffffffffffffc1a0;
              y_convolve_8tap_32x2_avx2();
              sr_y_round_store_32x2_avx2
                        ((__m256i *)CONCAT44(in_stack_ffffffffffffc14c,in_stack_ffffffffffffc148),
                         puVar124,0);
              local_1d6c = local_1d6c + -2;
            } while (local_1d6c != 0);
            local_1d68 = local_1d68 + 0x20;
          } while (local_1d68 < local_1d50);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_convolve_y_sr_avx2(const uint8_t *src, int32_t src_stride,
                            uint8_t *dst, int32_t dst_stride, int32_t w,
                            int32_t h,
                            const InterpFilterParams *filter_params_y,
                            const int32_t subpel_y_qn) {
#if CONFIG_SVT_AV1
  const int vert_tap = get_filter_tap(filter_params_y, subpel_y_qn);

  if (vert_tap == 12) {
    av1_convolve_y_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_y, subpel_y_qn);
  } else {
    av1_convolve_y_sr_specialized_avx2(src, src_stride, dst, dst_stride, w, h,
                                       filter_params_y, subpel_y_qn);
  }
#else
  av1_convolve_y_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                 filter_params_y, subpel_y_qn);
#endif
}